

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 (*pauVar83) [32];
  uint uVar84;
  uint uVar85;
  uint uVar86;
  ulong uVar87;
  int iVar88;
  ulong uVar89;
  long lVar90;
  ulong uVar91;
  float fVar92;
  float fVar124;
  float fVar126;
  vint4 bi_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar97 [16];
  undefined4 uVar93;
  float fVar94;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar112 [32];
  float fVar125;
  float fVar127;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar109 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar110 [16];
  undefined1 auVar123 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar145 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var_01 [56];
  undefined1 auVar149 [64];
  undefined1 extraout_var_02 [56];
  float fVar150;
  float fVar171;
  float fVar172;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar173;
  undefined1 auVar161 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar162 [32];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  vint4 ai_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar211;
  float fVar214;
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar198 [16];
  float fVar217;
  undefined1 auVar207 [32];
  float fVar212;
  float fVar215;
  float fVar218;
  undefined1 auVar208 [32];
  float fVar213;
  float fVar216;
  float fVar219;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 bi;
  undefined1 auVar238 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  undefined1 auVar232 [32];
  undefined1 auVar239 [32];
  undefined1 auVar236 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar240 [32];
  undefined1 auVar237 [16];
  undefined1 auVar241 [64];
  vint4 ai_1;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar256;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar257;
  float fVar261;
  float fVar262;
  undefined1 auVar258 [16];
  float fVar263;
  undefined1 auVar259 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [64];
  undefined1 auVar276 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar272;
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar277 [64];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c08;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 auStack_ab0 [16];
  undefined1 (*local_a88) [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined1 local_980 [32];
  undefined4 local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  Primitive *local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar233 [16];
  undefined1 auVar271 [64];
  undefined1 auVar275 [16];
  undefined1 auVar283 [64];
  
  PVar2 = prim[1];
  uVar91 = (ulong)(byte)PVar2;
  lVar90 = uVar91 * 0x19;
  fVar92 = *(float *)(prim + lVar90 + 0x12);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar6 = vsubps_avx(auVar6,*(undefined1 (*) [16])(prim + lVar90 + 6));
  auVar95._0_4_ = fVar92 * auVar6._0_4_;
  auVar95._4_4_ = fVar92 * auVar6._4_4_;
  auVar95._8_4_ = fVar92 * auVar6._8_4_;
  auVar95._12_4_ = fVar92 * auVar6._12_4_;
  auVar220._0_4_ = fVar92 * auVar7._0_4_;
  auVar220._4_4_ = fVar92 * auVar7._4_4_;
  auVar220._8_4_ = fVar92 * auVar7._8_4_;
  auVar220._12_4_ = fVar92 * auVar7._12_4_;
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar91 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar89 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + uVar91 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar89 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar288._4_4_ = auVar220._0_4_;
  auVar288._0_4_ = auVar220._0_4_;
  auVar288._8_4_ = auVar220._0_4_;
  auVar288._12_4_ = auVar220._0_4_;
  auVar132 = vshufps_avx(auVar220,auVar220,0x55);
  auVar96 = vshufps_avx(auVar220,auVar220,0xaa);
  fVar92 = auVar96._0_4_;
  auVar274._0_4_ = fVar92 * auVar8._0_4_;
  fVar124 = auVar96._4_4_;
  auVar274._4_4_ = fVar124 * auVar8._4_4_;
  fVar197 = auVar96._8_4_;
  auVar274._8_4_ = fVar197 * auVar8._8_4_;
  fVar211 = auVar96._12_4_;
  auVar274._12_4_ = fVar211 * auVar8._12_4_;
  auVar267._0_4_ = auVar10._0_4_ * fVar92;
  auVar267._4_4_ = auVar10._4_4_ * fVar124;
  auVar267._8_4_ = auVar10._8_4_ * fVar197;
  auVar267._12_4_ = auVar10._12_4_ * fVar211;
  auVar242._0_4_ = auVar151._0_4_ * fVar92;
  auVar242._4_4_ = auVar151._4_4_ * fVar124;
  auVar242._8_4_ = auVar151._8_4_ * fVar197;
  auVar242._12_4_ = auVar151._12_4_ * fVar211;
  auVar96 = vfmadd231ps_fma(auVar274,auVar132,auVar7);
  auVar133 = vfmadd231ps_fma(auVar267,auVar132,auVar102);
  auVar132 = vfmadd231ps_fma(auVar242,auVar105,auVar132);
  auVar174 = vfmadd231ps_fma(auVar96,auVar288,auVar6);
  auVar133 = vfmadd231ps_fma(auVar133,auVar288,auVar9);
  auVar159 = vfmadd231ps_fma(auVar132,auVar97,auVar288);
  auVar289._4_4_ = auVar95._0_4_;
  auVar289._0_4_ = auVar95._0_4_;
  auVar289._8_4_ = auVar95._0_4_;
  auVar289._12_4_ = auVar95._0_4_;
  auVar132 = vshufps_avx(auVar95,auVar95,0x55);
  auVar96 = vshufps_avx(auVar95,auVar95,0xaa);
  fVar92 = auVar96._0_4_;
  auVar221._0_4_ = fVar92 * auVar8._0_4_;
  fVar124 = auVar96._4_4_;
  auVar221._4_4_ = fVar124 * auVar8._4_4_;
  fVar197 = auVar96._8_4_;
  auVar221._8_4_ = fVar197 * auVar8._8_4_;
  fVar211 = auVar96._12_4_;
  auVar221._12_4_ = fVar211 * auVar8._12_4_;
  auVar131._0_4_ = auVar10._0_4_ * fVar92;
  auVar131._4_4_ = auVar10._4_4_ * fVar124;
  auVar131._8_4_ = auVar10._8_4_ * fVar197;
  auVar131._12_4_ = auVar10._12_4_ * fVar211;
  auVar96._0_4_ = auVar151._0_4_ * fVar92;
  auVar96._4_4_ = auVar151._4_4_ * fVar124;
  auVar96._8_4_ = auVar151._8_4_ * fVar197;
  auVar96._12_4_ = auVar151._12_4_ * fVar211;
  auVar7 = vfmadd231ps_fma(auVar221,auVar132,auVar7);
  auVar8 = vfmadd231ps_fma(auVar131,auVar132,auVar102);
  auVar102 = vfmadd231ps_fma(auVar96,auVar132,auVar105);
  auVar10 = vfmadd231ps_fma(auVar7,auVar289,auVar6);
  auVar105 = vfmadd231ps_fma(auVar8,auVar289,auVar9);
  auVar151 = vfmadd231ps_fma(auVar102,auVar289,auVar97);
  auVar234._8_4_ = 0x7fffffff;
  auVar234._0_8_ = 0x7fffffff7fffffff;
  auVar234._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx(auVar174,auVar234);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar6 = vcmpps_avx(auVar6,auVar198,1);
  auVar7 = vblendvps_avx(auVar174,auVar198,auVar6);
  auVar6 = vandps_avx(auVar133,auVar234);
  auVar6 = vcmpps_avx(auVar6,auVar198,1);
  auVar8 = vblendvps_avx(auVar133,auVar198,auVar6);
  auVar6 = vandps_avx(auVar159,auVar234);
  auVar6 = vcmpps_avx(auVar6,auVar198,1);
  auVar6 = vblendvps_avx(auVar159,auVar198,auVar6);
  auVar9 = vrcpps_avx(auVar7);
  auVar235._8_4_ = 0x3f800000;
  auVar235._0_8_ = 0x3f8000003f800000;
  auVar235._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar9,auVar235);
  auVar9 = vfmadd132ps_fma(auVar7,auVar9,auVar9);
  auVar7 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar7,auVar235);
  auVar102 = vfmadd132ps_fma(auVar8,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar7,auVar235);
  auVar97 = vfmadd132ps_fma(auVar6,auVar7,auVar7);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar10);
  auVar159._0_4_ = auVar9._0_4_ * auVar6._0_4_;
  auVar159._4_4_ = auVar9._4_4_ * auVar6._4_4_;
  auVar159._8_4_ = auVar9._8_4_ * auVar6._8_4_;
  auVar159._12_4_ = auVar9._12_4_ * auVar6._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar10);
  auVar222._0_4_ = auVar9._0_4_ * auVar6._0_4_;
  auVar222._4_4_ = auVar9._4_4_ * auVar6._4_4_;
  auVar222._8_4_ = auVar9._8_4_ * auVar6._8_4_;
  auVar222._12_4_ = auVar9._12_4_ * auVar6._12_4_;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar91 * -2 + 6);
  auVar6 = vpmovsxwd_avx(auVar9);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar105);
  auVar243._0_4_ = auVar6._0_4_ * auVar102._0_4_;
  auVar243._4_4_ = auVar6._4_4_ * auVar102._4_4_;
  auVar243._8_4_ = auVar6._8_4_ * auVar102._8_4_;
  auVar243._12_4_ = auVar6._12_4_ * auVar102._12_4_;
  auVar6 = vcvtdq2ps_avx(auVar7);
  auVar6 = vsubps_avx(auVar6,auVar105);
  auVar132._0_4_ = auVar102._0_4_ * auVar6._0_4_;
  auVar132._4_4_ = auVar102._4_4_ * auVar6._4_4_;
  auVar132._8_4_ = auVar102._8_4_ * auVar6._8_4_;
  auVar132._12_4_ = auVar102._12_4_ * auVar6._12_4_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar89 + uVar91 + 6);
  auVar6 = vpmovsxwd_avx(auVar102);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar151);
  auVar174._0_4_ = auVar97._0_4_ * auVar6._0_4_;
  auVar174._4_4_ = auVar97._4_4_ * auVar6._4_4_;
  auVar174._8_4_ = auVar97._8_4_ * auVar6._8_4_;
  auVar174._12_4_ = auVar97._12_4_ * auVar6._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar6 = vpmovsxwd_avx(auVar10);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar151);
  auVar105._0_4_ = auVar97._0_4_ * auVar6._0_4_;
  auVar105._4_4_ = auVar97._4_4_ * auVar6._4_4_;
  auVar105._8_4_ = auVar97._8_4_ * auVar6._8_4_;
  auVar105._12_4_ = auVar97._12_4_ * auVar6._12_4_;
  auVar6 = vpminsd_avx(auVar159,auVar222);
  auVar7 = vpminsd_avx(auVar243,auVar132);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  auVar7 = vpminsd_avx(auVar174,auVar105);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar258._4_4_ = uVar93;
  auVar258._0_4_ = uVar93;
  auVar258._8_4_ = uVar93;
  auVar258._12_4_ = uVar93;
  auVar7 = vmaxps_avx(auVar7,auVar258);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  local_580._0_4_ = auVar6._0_4_ * 0.99999964;
  local_580._4_4_ = auVar6._4_4_ * 0.99999964;
  local_580._8_4_ = auVar6._8_4_ * 0.99999964;
  local_580._12_4_ = auVar6._12_4_ * 0.99999964;
  auVar6 = vpmaxsd_avx(auVar159,auVar222);
  auVar7 = vpmaxsd_avx(auVar243,auVar132);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar7 = vpmaxsd_avx(auVar174,auVar105);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar151._4_4_ = uVar93;
  auVar151._0_4_ = uVar93;
  auVar151._8_4_ = uVar93;
  auVar151._12_4_ = uVar93;
  auVar7 = vminps_avx(auVar7,auVar151);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar97._0_4_ = auVar6._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar6._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar6._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar6._12_4_ * 1.0000004;
  auVar133[4] = PVar2;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar2;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar2;
  auVar133._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar133,_DAT_01f7fcf0);
  auVar6 = vcmpps_avx(local_580,auVar97,2);
  auVar6 = vandps_avx(auVar6,auVar7);
  uVar84 = vmovmskps_avx(auVar6);
  if (uVar84 == 0) {
    return;
  }
  uVar84 = uVar84 & 0xff;
  local_8b0 = prim + lVar90 + 0x16;
  auVar112._16_16_ = mm_lookupmask_ps._240_16_;
  auVar112._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,0x80);
  local_a88 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_860 = 0x7fffffff;
  uStack_85c = 0x7fffffff;
  uStack_858 = 0x7fffffff;
  uStack_854 = 0x7fffffff;
  uStack_850 = 0x7fffffff;
  uStack_84c = 0x7fffffff;
  uStack_848 = 0x7fffffff;
  uStack_844 = 0x7fffffff;
  local_660 = 0x80000000;
  uStack_65c = 0x80000000;
  uStack_658 = 0x80000000;
  uStack_654 = 0x80000000;
  fStack_650 = -0.0;
  fStack_64c = -0.0;
  fStack_648 = -0.0;
  uStack_644 = 0x80000000;
  local_8a8 = prim;
LAB_015b4671:
  lVar90 = 0;
  uVar91 = (ulong)uVar84;
  for (uVar89 = uVar91; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
    lVar90 = lVar90 + 1;
  }
  uVar91 = uVar91 - 1 & uVar91;
  local_960 = *(undefined4 *)(local_8a8 + lVar90 * 4 + 6);
  uVar89 = (ulong)(uint)((int)lVar90 << 6);
  auVar6 = *(undefined1 (*) [16])(local_8b0 + uVar89);
  if (uVar91 != 0) {
    uVar87 = uVar91 - 1 & uVar91;
    for (uVar17 = uVar91; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
    }
    if (uVar87 != 0) {
      for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar7 = *(undefined1 (*) [16])(local_8b0 + uVar89 + 0x10);
  auVar8 = *(undefined1 (*) [16])(local_8b0 + uVar89 + 0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar10 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar268._4_4_ = uVar93;
  auVar268._0_4_ = uVar93;
  auVar268._8_4_ = uVar93;
  auVar268._12_4_ = uVar93;
  fStack_810 = (float)uVar93;
  _local_820 = auVar268;
  fStack_80c = (float)uVar93;
  fStack_808 = (float)uVar93;
  register0x0000149c = uVar93;
  auVar271 = ZEXT3264(_local_820);
  auVar9 = *(undefined1 (*) [16])(local_8b0 + uVar89 + 0x30);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar275._4_4_ = uVar93;
  auVar275._0_4_ = uVar93;
  auVar275._8_4_ = uVar93;
  auVar275._12_4_ = uVar93;
  fStack_7f0 = (float)uVar93;
  _local_800 = auVar275;
  fStack_7ec = (float)uVar93;
  fStack_7e8 = (float)uVar93;
  register0x000014dc = uVar93;
  auVar277 = ZEXT3264(_local_800);
  auVar102 = vunpcklps_avx(auVar268,auVar275);
  fVar92 = *(float *)(ray + k * 4 + 0x60);
  auVar278._4_4_ = fVar92;
  auVar278._0_4_ = fVar92;
  auVar278._8_4_ = fVar92;
  auVar278._12_4_ = fVar92;
  fStack_990 = fVar92;
  _local_9a0 = auVar278;
  fStack_98c = fVar92;
  fStack_988 = fVar92;
  register0x0000151c = fVar92;
  auVar283 = ZEXT3264(_local_9a0);
  local_9f0 = vinsertps_avx(auVar102,auVar278,0x28);
  auVar223._0_4_ = (auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_ + auVar9._0_4_) * 0.25;
  auVar223._4_4_ = (auVar6._4_4_ + auVar7._4_4_ + auVar8._4_4_ + auVar9._4_4_) * 0.25;
  auVar223._8_4_ = (auVar6._8_4_ + auVar7._8_4_ + auVar8._8_4_ + auVar9._8_4_) * 0.25;
  auVar223._12_4_ = (auVar6._12_4_ + auVar7._12_4_ + auVar8._12_4_ + auVar9._12_4_) * 0.25;
  auVar102 = vsubps_avx(auVar223,auVar10);
  auVar102 = vdpps_avx(auVar102,local_9f0,0x7f);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar260 = ZEXT1664(local_a00);
  uVar84 = *(uint *)(local_8a8 + 2);
  auVar97 = vrcpss_avx(local_a00,local_a00);
  auVar105 = vfnmadd213ss_fma(auVar97,local_a00,ZEXT416(0x40000000));
  local_2e0 = auVar102._0_4_ * auVar97._0_4_ * auVar105._0_4_;
  auVar230._4_4_ = local_2e0;
  auVar230._0_4_ = local_2e0;
  auVar230._8_4_ = local_2e0;
  auVar230._12_4_ = local_2e0;
  fStack_910 = local_2e0;
  _local_920 = auVar230;
  fStack_90c = local_2e0;
  fStack_908 = local_2e0;
  fStack_904 = local_2e0;
  auVar102 = vfmadd231ps_fma(auVar10,local_9f0,auVar230);
  auVar102 = vblendps_avx(auVar102,_DAT_01f7aa10,8);
  auVar10 = vsubps_avx(auVar6,auVar102);
  auVar8 = vsubps_avx(auVar8,auVar102);
  auVar97 = vsubps_avx(auVar7,auVar102);
  auVar9 = vsubps_avx(auVar9,auVar102);
  auVar6 = vmovshdup_avx(auVar10);
  local_400 = auVar6._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar6 = vshufps_avx(auVar10,auVar10,0xaa);
  local_1e0 = auVar6._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar6 = vshufps_avx(auVar10,auVar10,0xff);
  local_420 = auVar6._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar6 = vmovshdup_avx(auVar97);
  local_200 = auVar6._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar6 = vshufps_avx(auVar97,auVar97,0xaa);
  local_220 = auVar6._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar6 = vshufps_avx(auVar97,auVar97,0xff);
  local_240 = auVar6._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar6 = vmovshdup_avx(auVar8);
  local_440 = auVar6._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar6 = vshufps_avx(auVar8,auVar8,0xaa);
  local_460 = auVar6._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar6 = vshufps_avx(auVar8,auVar8,0xff);
  local_480 = auVar6._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar6 = vmovshdup_avx(auVar9);
  local_4a0 = auVar6._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar6 = vshufps_avx(auVar9,auVar9,0xaa);
  local_4c0 = auVar6._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar6 = vshufps_avx(auVar9,auVar9,0xff);
  local_4e0 = auVar6._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar6 = vfmadd231ps_fma(ZEXT432((uint)(fVar92 * fVar92)),_local_800,_local_800);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_820,_local_820);
  uVar93 = auVar6._0_4_;
  local_260._4_4_ = uVar93;
  local_260._0_4_ = uVar93;
  local_260._8_4_ = uVar93;
  local_260._12_4_ = uVar93;
  local_260._16_4_ = uVar93;
  local_260._20_4_ = uVar93;
  local_260._24_4_ = uVar93;
  local_260._28_4_ = uVar93;
  auVar241 = ZEXT3264(local_260);
  fVar92 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar92 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_c08 = 1;
  uVar89 = 0;
  local_500 = auVar10._0_4_;
  uStack_4fc = local_500;
  uStack_4f8 = local_500;
  uStack_4f4 = local_500;
  uStack_4f0 = local_500;
  uStack_4ec = local_500;
  uStack_4e8 = local_500;
  uStack_4e4 = local_500;
  local_280 = auVar97._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_520 = auVar8._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  fVar124 = auVar9._0_4_;
  local_540 = fVar124;
  fStack_53c = fVar124;
  fStack_538 = fVar124;
  fStack_534 = fVar124;
  fStack_530 = fVar124;
  fStack_52c = fVar124;
  fStack_528 = fVar124;
  fStack_524 = fVar124;
  auVar145._4_4_ = uStack_85c;
  auVar145._0_4_ = local_860;
  auVar145._8_4_ = uStack_858;
  auVar145._12_4_ = uStack_854;
  auVar145._16_4_ = uStack_850;
  auVar145._20_4_ = uStack_84c;
  auVar145._24_4_ = uStack_848;
  auVar145._28_4_ = uStack_844;
  local_560 = vandps_avx(local_260,auVar145);
  auVar6 = vsqrtss_avx(local_a00,local_a00);
  auVar7 = vsqrtss_avx(local_a00,local_a00);
  local_570 = ZEXT816(0x3f80000000000000);
  local_760 = local_960;
  uStack_75c = local_960;
  uStack_758 = local_960;
  uStack_754 = local_960;
  local_750 = uVar84;
  uStack_74c = uVar84;
  uStack_748 = uVar84;
  uStack_744 = uVar84;
  do {
    auVar189._8_4_ = 0x3f800000;
    auVar189._0_8_ = 0x3f8000003f800000;
    auVar189._12_4_ = 0x3f800000;
    auVar189._16_4_ = 0x3f800000;
    auVar189._20_4_ = 0x3f800000;
    iVar88 = (int)uVar89;
    auVar189._24_4_ = 0x3f800000;
    auVar189._28_4_ = 0x3f800000;
    auVar102 = vmovshdup_avx(local_570);
    auVar102 = vsubps_avx(auVar102,local_570);
    local_7a0._0_4_ = auVar102._0_4_;
    fVar218 = (float)local_7a0._0_4_ * 0.04761905;
    uVar93 = local_570._0_4_;
    local_940._4_4_ = uVar93;
    local_940._0_4_ = uVar93;
    local_940._8_4_ = uVar93;
    local_940._12_4_ = uVar93;
    local_940._16_4_ = uVar93;
    local_940._20_4_ = uVar93;
    local_940._24_4_ = uVar93;
    local_940._28_4_ = uVar93;
    local_7a0._4_4_ = local_7a0._0_4_;
    local_7a0._8_4_ = local_7a0._0_4_;
    local_7a0._12_4_ = local_7a0._0_4_;
    local_7a0._16_4_ = local_7a0._0_4_;
    local_7a0._20_4_ = local_7a0._0_4_;
    local_7a0._24_4_ = local_7a0._0_4_;
    local_7a0._28_4_ = local_7a0._0_4_;
    auVar102 = vfmadd231ps_fma(local_940,local_7a0,_DAT_01faff20);
    auVar112 = vsubps_avx(auVar189,ZEXT1632(auVar102));
    fVar197 = auVar112._0_4_;
    fVar214 = auVar112._4_4_;
    fVar213 = auVar112._8_4_;
    fVar256 = auVar112._12_4_;
    fVar215 = auVar112._16_4_;
    fVar273 = auVar112._20_4_;
    fVar219 = auVar112._24_4_;
    fVar94 = fVar197 * fVar197 * fVar197;
    fVar125 = fVar214 * fVar214 * fVar214;
    fVar126 = fVar213 * fVar213 * fVar213;
    fVar127 = fVar256 * fVar256 * fVar256;
    fVar128 = fVar215 * fVar215 * fVar215;
    fVar129 = fVar273 * fVar273 * fVar273;
    fVar130 = fVar219 * fVar219 * fVar219;
    fVar211 = auVar102._0_4_;
    fVar217 = auVar102._4_4_;
    fVar212 = auVar102._8_4_;
    fVar216 = auVar102._12_4_;
    fVar150 = fVar211 * fVar211 * fVar211;
    fVar171 = fVar217 * fVar217 * fVar217;
    fVar172 = fVar212 * fVar212 * fVar212;
    fVar173 = fVar216 * fVar216 * fVar216;
    fVar257 = fVar197 * fVar211;
    fVar261 = fVar214 * fVar217;
    fVar262 = fVar213 * fVar212;
    fVar263 = fVar256 * fVar216;
    fVar264 = fVar215 * 0.0;
    fVar265 = fVar273 * 0.0;
    fVar266 = fVar219 * 0.0;
    fVar272 = auVar271._28_4_ + auVar283._28_4_;
    auVar280._4_4_ = fVar125 * 0.16666667;
    auVar280._0_4_ = fVar94 * 0.16666667;
    auVar280._8_4_ = fVar126 * 0.16666667;
    auVar280._12_4_ = fVar127 * 0.16666667;
    auVar280._16_4_ = fVar128 * 0.16666667;
    auVar280._20_4_ = fVar129 * 0.16666667;
    auVar280._24_4_ = fVar130 * 0.16666667;
    auVar280._28_4_ = fVar272 + (float)local_7a0._0_4_;
    auVar11._4_4_ =
         (fVar214 * fVar261 * 12.0 + fVar261 * fVar217 * 6.0 + fVar171 + fVar125 * 4.0) * 0.16666667
    ;
    auVar11._0_4_ =
         (fVar197 * fVar257 * 12.0 + fVar257 * fVar211 * 6.0 + fVar150 + fVar94 * 4.0) * 0.16666667;
    auVar11._8_4_ =
         (fVar213 * fVar262 * 12.0 + fVar262 * fVar212 * 6.0 + fVar172 + fVar126 * 4.0) * 0.16666667
    ;
    auVar11._12_4_ =
         (fVar256 * fVar263 * 12.0 + fVar263 * fVar216 * 6.0 + fVar173 + fVar127 * 4.0) * 0.16666667
    ;
    auVar11._16_4_ =
         (fVar215 * fVar264 * 12.0 + fVar264 * 0.0 * 6.0 + fVar128 * 4.0 + 0.0) * 0.16666667;
    auVar11._20_4_ =
         (fVar273 * fVar265 * 12.0 + fVar265 * 0.0 * 6.0 + fVar129 * 4.0 + 0.0) * 0.16666667;
    auVar11._24_4_ =
         (fVar219 * fVar266 * 12.0 + fVar266 * 0.0 * 6.0 + fVar130 * 4.0 + 0.0) * 0.16666667;
    auVar11._28_4_ = auVar277._28_4_;
    auVar252._4_4_ =
         (fVar171 * 4.0 + fVar125 + fVar261 * fVar217 * 12.0 + fVar214 * fVar261 * 6.0) * 0.16666667
    ;
    auVar252._0_4_ =
         (fVar150 * 4.0 + fVar94 + fVar257 * fVar211 * 12.0 + fVar197 * fVar257 * 6.0) * 0.16666667;
    auVar252._8_4_ =
         (fVar172 * 4.0 + fVar126 + fVar262 * fVar212 * 12.0 + fVar213 * fVar262 * 6.0) * 0.16666667
    ;
    auVar252._12_4_ =
         (fVar173 * 4.0 + fVar127 + fVar263 * fVar216 * 12.0 + fVar256 * fVar263 * 6.0) * 0.16666667
    ;
    auVar252._16_4_ = (fVar128 + 0.0 + fVar264 * 0.0 * 12.0 + fVar215 * fVar264 * 6.0) * 0.16666667;
    auVar252._20_4_ = (fVar129 + 0.0 + fVar265 * 0.0 * 12.0 + fVar273 * fVar265 * 6.0) * 0.16666667;
    auVar252._24_4_ = (fVar130 + 0.0 + fVar266 * 0.0 * 12.0 + fVar219 * fVar266 * 6.0) * 0.16666667;
    auVar252._28_4_ = auVar283._28_4_;
    fVar150 = fVar150 * 0.16666667;
    fVar171 = fVar171 * 0.16666667;
    fVar172 = fVar172 * 0.16666667;
    fVar173 = fVar173 * 0.16666667;
    auVar117._4_4_ = fVar171 * fStack_53c;
    auVar117._0_4_ = fVar150 * local_540;
    auVar117._8_4_ = fVar172 * fStack_538;
    auVar117._12_4_ = fVar173 * fStack_534;
    auVar117._16_4_ = fStack_530 * 0.0;
    auVar117._20_4_ = fStack_52c * 0.0;
    auVar117._24_4_ = fStack_528 * 0.0;
    auVar117._28_4_ = local_7a0._0_4_;
    auVar13._4_4_ = fVar171 * local_4a0._4_4_;
    auVar13._0_4_ = fVar150 * (float)local_4a0;
    auVar13._8_4_ = fVar172 * (float)uStack_498;
    auVar13._12_4_ = fVar173 * uStack_498._4_4_;
    auVar13._16_4_ = (float)uStack_490 * 0.0;
    auVar13._20_4_ = uStack_490._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_488 * 0.0;
    auVar13._28_4_ = fVar272 + DAT_01faff20._28_4_ + 0.0;
    auVar14._4_4_ = fVar171 * local_4c0._4_4_;
    auVar14._0_4_ = fVar150 * (float)local_4c0;
    auVar14._8_4_ = fVar172 * (float)uStack_4b8;
    auVar14._12_4_ = fVar173 * uStack_4b8._4_4_;
    auVar14._16_4_ = (float)uStack_4b0 * 0.0;
    auVar14._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar14._24_4_ = (float)uStack_4a8 * 0.0;
    auVar14._28_4_ = 0;
    auVar15._4_4_ = fVar171 * local_4e0._4_4_;
    auVar15._0_4_ = fVar150 * (float)local_4e0;
    auVar15._8_4_ = fVar172 * (float)uStack_4d8;
    auVar15._12_4_ = fVar173 * uStack_4d8._4_4_;
    auVar15._16_4_ = (float)uStack_4d0 * 0.0;
    auVar15._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_4c8 * 0.0;
    auVar15._28_4_ = 0x40c00000;
    auVar113._4_4_ = uStack_51c;
    auVar113._0_4_ = local_520;
    auVar113._8_4_ = uStack_518;
    auVar113._12_4_ = uStack_514;
    auVar113._16_4_ = uStack_510;
    auVar113._20_4_ = uStack_50c;
    auVar113._24_4_ = uStack_508;
    auVar113._28_4_ = uStack_504;
    auVar102 = vfmadd231ps_fma(auVar117,auVar252,auVar113);
    auVar69._8_8_ = uStack_438;
    auVar69._0_8_ = local_440;
    auVar69._16_8_ = uStack_430;
    auVar69._24_8_ = uStack_428;
    auVar105 = vfmadd231ps_fma(auVar13,auVar252,auVar69);
    auVar67._8_8_ = uStack_458;
    auVar67._0_8_ = local_460;
    auVar67._16_8_ = uStack_450;
    auVar67._24_8_ = uStack_448;
    auVar151 = vfmadd231ps_fma(auVar14,auVar252,auVar67);
    auVar65._8_8_ = uStack_478;
    auVar65._0_8_ = local_480;
    auVar65._16_8_ = uStack_470;
    auVar65._24_8_ = uStack_468;
    auVar132 = vfmadd231ps_fma(auVar15,auVar252,auVar65);
    auVar78._4_4_ = uStack_27c;
    auVar78._0_4_ = local_280;
    auVar78._8_4_ = uStack_278;
    auVar78._12_4_ = uStack_274;
    auVar78._16_4_ = uStack_270;
    auVar78._20_4_ = uStack_26c;
    auVar78._24_4_ = uStack_268;
    auVar78._28_4_ = uStack_264;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar11,auVar78);
    auVar81._8_8_ = uStack_1f8;
    auVar81._0_8_ = local_200;
    auVar81._16_8_ = uStack_1f0;
    auVar81._24_8_ = uStack_1e8;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar11,auVar81);
    auVar80._8_8_ = uStack_218;
    auVar80._0_8_ = local_220;
    auVar80._16_8_ = uStack_210;
    auVar80._24_8_ = uStack_208;
    auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar11,auVar80);
    auVar79._8_8_ = uStack_238;
    auVar79._0_8_ = local_240;
    auVar79._16_8_ = uStack_230;
    auVar79._24_8_ = uStack_228;
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar79,auVar11);
    auVar63._4_4_ = uStack_4fc;
    auVar63._0_4_ = local_500;
    auVar63._8_4_ = uStack_4f8;
    auVar63._12_4_ = uStack_4f4;
    auVar63._16_4_ = uStack_4f0;
    auVar63._20_4_ = uStack_4ec;
    auVar63._24_4_ = uStack_4e8;
    auVar63._28_4_ = uStack_4e4;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar280,auVar63);
    auVar113 = ZEXT1632(auVar102);
    auVar73._8_8_ = uStack_3f8;
    auVar73._0_8_ = local_400;
    auVar73._16_8_ = uStack_3f0;
    auVar73._24_8_ = uStack_3e8;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar280,auVar73);
    local_980 = ZEXT1632(auVar105);
    auVar82._8_8_ = uStack_1d8;
    auVar82._0_8_ = local_1e0;
    auVar82._16_8_ = uStack_1d0;
    auVar82._24_8_ = uStack_1c8;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar280,auVar82);
    auVar71._8_8_ = uStack_418;
    auVar71._0_8_ = local_420;
    auVar71._16_8_ = uStack_410;
    auVar71._24_8_ = uStack_408;
    auVar151 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar280,auVar71);
    auVar232._0_4_ = (float)((uint)fVar211 ^ local_660) * fVar211;
    auVar232._4_4_ = (float)((uint)fVar217 ^ uStack_65c) * fVar217;
    auVar232._8_4_ = (float)((uint)fVar212 ^ uStack_658) * fVar212;
    auVar232._12_4_ = (float)((uint)fVar216 ^ uStack_654) * fVar216;
    auVar232._16_4_ = fStack_650 * 0.0;
    auVar232._20_4_ = fStack_64c * 0.0;
    auVar232._24_4_ = fStack_648 * 0.0;
    auVar232._28_4_ = 0;
    auVar142._4_4_ = fVar261 * 4.0;
    auVar142._0_4_ = fVar257 * 4.0;
    auVar142._8_4_ = fVar262 * 4.0;
    auVar142._12_4_ = fVar263 * 4.0;
    auVar142._16_4_ = fVar264 * 4.0;
    auVar142._20_4_ = fVar265 * 4.0;
    fVar94 = auVar260._28_4_;
    auVar142._24_4_ = fVar266 * 4.0;
    auVar142._28_4_ = fVar94;
    auVar145 = vsubps_avx(auVar232,auVar142);
    auVar161._4_4_ = fVar214 * (float)((uint)fVar214 ^ uStack_65c) * 0.5;
    auVar161._0_4_ = fVar197 * (float)((uint)fVar197 ^ local_660) * 0.5;
    auVar161._8_4_ = fVar213 * (float)((uint)fVar213 ^ uStack_658) * 0.5;
    auVar161._12_4_ = fVar256 * (float)((uint)fVar256 ^ uStack_654) * 0.5;
    auVar161._16_4_ = fVar215 * (float)((uint)fVar215 ^ (uint)fStack_650) * 0.5;
    auVar161._20_4_ = fVar273 * (float)((uint)fVar273 ^ (uint)fStack_64c) * 0.5;
    auVar161._24_4_ = fVar219 * (float)((uint)fVar219 ^ (uint)fStack_648) * 0.5;
    auVar161._28_4_ = auVar112._28_4_;
    auVar276._4_4_ = auVar145._4_4_ * 0.5;
    auVar276._0_4_ = auVar145._0_4_ * 0.5;
    auVar276._8_4_ = auVar145._8_4_ * 0.5;
    auVar276._12_4_ = auVar145._12_4_ * 0.5;
    auVar276._16_4_ = auVar145._16_4_ * 0.5;
    auVar276._20_4_ = auVar145._20_4_ * 0.5;
    auVar276._24_4_ = auVar145._24_4_ * 0.5;
    auVar276._28_4_ = auVar145._28_4_;
    auVar295._4_4_ = (fVar261 * 4.0 + fVar214 * fVar214) * 0.5;
    auVar295._0_4_ = (fVar257 * 4.0 + fVar197 * fVar197) * 0.5;
    auVar295._8_4_ = (fVar262 * 4.0 + fVar213 * fVar213) * 0.5;
    auVar295._12_4_ = (fVar263 * 4.0 + fVar256 * fVar256) * 0.5;
    auVar295._16_4_ = (fVar264 * 4.0 + fVar215 * fVar215) * 0.5;
    auVar295._20_4_ = (fVar265 * 4.0 + fVar273 * fVar273) * 0.5;
    auVar295._24_4_ = (fVar266 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar295._28_4_ = fVar94 + auVar241._28_4_;
    fVar197 = fVar211 * fVar211 * 0.5;
    fVar211 = fVar217 * fVar217 * 0.5;
    fVar214 = fVar212 * fVar212 * 0.5;
    fVar217 = fVar216 * fVar216 * 0.5;
    auVar238._4_4_ = fVar211 * fStack_53c;
    auVar238._0_4_ = fVar197 * local_540;
    auVar238._8_4_ = fVar214 * fStack_538;
    auVar238._12_4_ = fVar217 * fStack_534;
    auVar238._16_4_ = fStack_530 * 0.0;
    auVar238._20_4_ = fStack_52c * 0.0;
    auVar238._24_4_ = fStack_528 * 0.0;
    auVar238._28_4_ = fVar94;
    auVar209._4_4_ = fVar211 * local_4a0._4_4_;
    auVar209._0_4_ = fVar197 * (float)local_4a0;
    auVar209._8_4_ = fVar214 * (float)uStack_498;
    auVar209._12_4_ = fVar217 * uStack_498._4_4_;
    auVar209._16_4_ = (float)uStack_490 * 0.0;
    auVar209._20_4_ = uStack_490._4_4_ * 0.0;
    auVar209._24_4_ = (float)uStack_488 * 0.0;
    auVar209._28_4_ = uStack_644;
    auVar12._4_4_ = fVar211 * local_4c0._4_4_;
    auVar12._0_4_ = fVar197 * (float)local_4c0;
    auVar12._8_4_ = fVar214 * (float)uStack_4b8;
    auVar12._12_4_ = fVar217 * uStack_4b8._4_4_;
    auVar12._16_4_ = (float)uStack_4b0 * 0.0;
    auVar12._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar12._24_4_ = (float)uStack_4a8 * 0.0;
    auVar12._28_4_ = auVar277._28_4_;
    auVar18._4_4_ = fVar211 * local_4e0._4_4_;
    auVar18._0_4_ = fVar197 * (float)local_4e0;
    auVar18._8_4_ = fVar214 * (float)uStack_4d8;
    auVar18._12_4_ = fVar217 * uStack_4d8._4_4_;
    auVar18._16_4_ = (float)uStack_4d0 * 0.0;
    auVar18._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar18._24_4_ = (float)uStack_4c8 * 0.0;
    auVar18._28_4_ = 0;
    auVar62._4_4_ = uStack_51c;
    auVar62._0_4_ = local_520;
    auVar62._8_4_ = uStack_518;
    auVar62._12_4_ = uStack_514;
    auVar62._16_4_ = uStack_510;
    auVar62._20_4_ = uStack_50c;
    auVar62._24_4_ = uStack_508;
    auVar62._28_4_ = uStack_504;
    auVar132 = vfmadd231ps_fma(auVar238,auVar295,auVar62);
    auVar70._8_8_ = uStack_438;
    auVar70._0_8_ = local_440;
    auVar70._16_8_ = uStack_430;
    auVar70._24_8_ = uStack_428;
    auVar96 = vfmadd231ps_fma(auVar209,auVar295,auVar70);
    auVar68._8_8_ = uStack_458;
    auVar68._0_8_ = local_460;
    auVar68._16_8_ = uStack_450;
    auVar68._24_8_ = uStack_448;
    auVar133 = vfmadd231ps_fma(auVar12,auVar295,auVar68);
    auVar66._8_8_ = uStack_478;
    auVar66._0_8_ = local_480;
    auVar66._16_8_ = uStack_470;
    auVar66._24_8_ = uStack_468;
    auVar174 = vfmadd231ps_fma(auVar18,auVar295,auVar66);
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar276,auVar78);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar276,auVar81);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar276,auVar80);
    auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar79,auVar276);
    auVar64._4_4_ = uStack_4fc;
    auVar64._0_4_ = local_500;
    auVar64._8_4_ = uStack_4f8;
    auVar64._12_4_ = uStack_4f4;
    auVar64._16_4_ = uStack_4f0;
    auVar64._20_4_ = uStack_4ec;
    auVar64._24_4_ = uStack_4e8;
    auVar64._28_4_ = uStack_4e4;
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar161,auVar64);
    auVar74._8_8_ = uStack_3f8;
    auVar74._0_8_ = local_400;
    auVar74._16_8_ = uStack_3f0;
    auVar74._24_8_ = uStack_3e8;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar161,auVar74);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar161,auVar82);
    auVar72._8_8_ = uStack_418;
    auVar72._0_8_ = local_420;
    auVar72._16_8_ = uStack_410;
    auVar72._24_8_ = uStack_408;
    auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar161,auVar72);
    local_b00._0_4_ = auVar132._0_4_ * fVar218;
    local_b00._4_4_ = auVar132._4_4_ * fVar218;
    local_b00._8_4_ = auVar132._8_4_ * fVar218;
    local_b00._12_4_ = auVar132._12_4_ * fVar218;
    local_b00._16_4_ = fVar218 * 0.0;
    local_b00._20_4_ = fVar218 * 0.0;
    local_b00._24_4_ = fVar218 * 0.0;
    local_b00._28_4_ = 0;
    fVar197 = auVar96._0_4_ * fVar218;
    fVar211 = auVar96._4_4_ * fVar218;
    local_a20._4_4_ = fVar211;
    local_a20._0_4_ = fVar197;
    fVar214 = auVar96._8_4_ * fVar218;
    local_a20._8_4_ = fVar214;
    fVar217 = auVar96._12_4_ * fVar218;
    local_a20._12_4_ = fVar217;
    local_a20._16_4_ = fVar218 * 0.0;
    local_a20._20_4_ = fVar218 * 0.0;
    local_a20._24_4_ = fVar218 * 0.0;
    local_a20._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    fVar130 = auVar133._0_4_ * fVar218;
    fVar150 = auVar133._4_4_ * fVar218;
    auVar19._4_4_ = fVar150;
    auVar19._0_4_ = fVar130;
    fVar171 = auVar133._8_4_ * fVar218;
    auVar19._8_4_ = fVar171;
    fVar172 = auVar133._12_4_ * fVar218;
    auVar19._12_4_ = fVar172;
    fVar173 = fVar218 * 0.0;
    auVar19._16_4_ = fVar173;
    fVar257 = fVar218 * 0.0;
    auVar19._20_4_ = fVar257;
    uVar93 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    fVar261 = fVar218 * 0.0;
    auVar19._24_4_ = fVar261;
    auVar19._28_4_ = uVar93;
    auVar207._0_4_ = fVar218 * auVar174._0_4_;
    auVar207._4_4_ = fVar218 * auVar174._4_4_;
    auVar207._8_4_ = fVar218 * auVar174._8_4_;
    auVar207._12_4_ = fVar218 * auVar174._12_4_;
    auVar207._16_4_ = fVar218 * 0.0;
    auVar207._20_4_ = fVar218 * 0.0;
    auVar207._24_4_ = fVar218 * 0.0;
    auVar207._28_4_ = 0;
    auVar13 = vpermps_avx2(_DAT_01fec480,auVar113);
    local_ae0 = vpermps_avx2(_DAT_01fec480,local_980);
    auVar161 = ZEXT1632(auVar102);
    local_780 = vpermps_avx2(_DAT_01fec480,auVar161);
    local_600 = vsubps_avx(auVar13,auVar113);
    local_5e0 = vsubps_avx(local_780,ZEXT1632(auVar102));
    fVar216 = local_5e0._0_4_;
    fVar215 = local_5e0._4_4_;
    auVar20._4_4_ = fVar215 * local_b00._4_4_;
    auVar20._0_4_ = fVar216 * (float)local_b00._0_4_;
    fVar219 = local_5e0._8_4_;
    auVar20._8_4_ = fVar219 * local_b00._8_4_;
    fVar94 = local_5e0._12_4_;
    auVar20._12_4_ = fVar94 * local_b00._12_4_;
    fVar125 = local_5e0._16_4_;
    auVar20._16_4_ = fVar125 * local_b00._16_4_;
    fVar126 = local_5e0._20_4_;
    auVar20._20_4_ = fVar126 * local_b00._20_4_;
    fVar127 = local_5e0._24_4_;
    auVar20._24_4_ = fVar127 * local_b00._24_4_;
    auVar20._28_4_ = auVar13._28_4_;
    auVar102 = vfmsub231ps_fma(auVar20,auVar19,local_600);
    local_620 = vsubps_avx(local_ae0,local_980);
    fVar265 = local_600._0_4_;
    fVar266 = local_600._4_4_;
    auVar21._4_4_ = fVar266 * fVar211;
    auVar21._0_4_ = fVar265 * fVar197;
    fVar272 = local_600._8_4_;
    auVar21._8_4_ = fVar272 * fVar214;
    fVar290 = local_600._12_4_;
    auVar21._12_4_ = fVar290 * fVar217;
    fVar291 = local_600._16_4_;
    auVar21._16_4_ = fVar291 * fVar218 * 0.0;
    fVar292 = local_600._20_4_;
    auVar21._20_4_ = fVar292 * fVar218 * 0.0;
    fVar293 = local_600._24_4_;
    auVar21._24_4_ = fVar293 * fVar218 * 0.0;
    auVar21._28_4_ = local_ae0._28_4_;
    auVar132 = vfmsub231ps_fma(auVar21,local_b00,local_620);
    auVar102 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar132._12_4_ * auVar132._12_4_,
                                                  CONCAT48(auVar132._8_4_ * auVar132._8_4_,
                                                           CONCAT44(auVar132._4_4_ * auVar132._4_4_,
                                                                    auVar132._0_4_ * auVar132._0_4_)
                                                          ))),ZEXT1632(auVar102),ZEXT1632(auVar102))
    ;
    fVar273 = local_620._0_4_;
    fVar218 = local_620._4_4_;
    auVar22._4_4_ = fVar218 * fVar150;
    auVar22._0_4_ = fVar273 * fVar130;
    fVar128 = local_620._8_4_;
    auVar22._8_4_ = fVar128 * fVar171;
    fVar129 = local_620._12_4_;
    auVar22._12_4_ = fVar129 * fVar172;
    fVar262 = local_620._16_4_;
    auVar22._16_4_ = fVar262 * fVar173;
    fVar263 = local_620._20_4_;
    auVar22._20_4_ = fVar263 * fVar257;
    fVar264 = local_620._24_4_;
    auVar22._24_4_ = fVar264 * fVar261;
    auVar22._28_4_ = local_780._28_4_;
    auVar96 = vfmsub231ps_fma(auVar22,local_a20,local_5e0);
    auVar190._0_4_ = fVar216 * fVar216;
    auVar190._4_4_ = fVar215 * fVar215;
    auVar190._8_4_ = fVar219 * fVar219;
    auVar190._12_4_ = fVar94 * fVar94;
    auVar190._16_4_ = fVar125 * fVar125;
    auVar190._20_4_ = fVar126 * fVar126;
    auVar190._24_4_ = fVar127 * fVar127;
    auVar190._28_4_ = 0;
    auVar132 = vfmadd231ps_fma(auVar190,local_620,local_620);
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_600,local_600);
    auVar112 = vrcpps_avx(ZEXT1632(auVar132));
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar96),ZEXT1632(auVar96));
    auVar114._8_4_ = 0x3f800000;
    auVar114._0_8_ = 0x3f8000003f800000;
    auVar114._12_4_ = 0x3f800000;
    auVar114._16_4_ = 0x3f800000;
    auVar114._20_4_ = 0x3f800000;
    auVar114._24_4_ = 0x3f800000;
    auVar114._28_4_ = 0x3f800000;
    auVar102 = vfnmadd213ps_fma(auVar112,ZEXT1632(auVar132),auVar114);
    auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar112,auVar112);
    local_a40 = vpermps_avx2(_DAT_01fec480,local_b00);
    auVar14 = vpermps_avx2(_DAT_01fec480,auVar19);
    auVar23._4_4_ = fVar215 * local_a40._4_4_;
    auVar23._0_4_ = fVar216 * local_a40._0_4_;
    auVar23._8_4_ = fVar219 * local_a40._8_4_;
    auVar23._12_4_ = fVar94 * local_a40._12_4_;
    auVar23._16_4_ = fVar125 * local_a40._16_4_;
    auVar23._20_4_ = fVar126 * local_a40._20_4_;
    auVar23._24_4_ = fVar127 * local_a40._24_4_;
    auVar23._28_4_ = auVar112._28_4_;
    auVar133 = vfmsub231ps_fma(auVar23,auVar14,local_600);
    local_a60 = vpermps_avx2(_DAT_01fec480,local_a20);
    auVar24._4_4_ = fVar266 * local_a60._4_4_;
    auVar24._0_4_ = fVar265 * local_a60._0_4_;
    auVar24._8_4_ = fVar272 * local_a60._8_4_;
    auVar24._12_4_ = fVar290 * local_a60._12_4_;
    auVar24._16_4_ = fVar291 * local_a60._16_4_;
    auVar24._20_4_ = fVar292 * local_a60._20_4_;
    auVar24._24_4_ = fVar293 * local_a60._24_4_;
    auVar24._28_4_ = 0;
    auVar174 = vfmsub231ps_fma(auVar24,local_a40,local_620);
    auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar174._12_4_ * auVar174._12_4_,
                                                  CONCAT48(auVar174._8_4_ * auVar174._8_4_,
                                                           CONCAT44(auVar174._4_4_ * auVar174._4_4_,
                                                                    auVar174._0_4_ * auVar174._0_4_)
                                                          ))),ZEXT1632(auVar133),ZEXT1632(auVar133))
    ;
    auVar245._0_4_ = fVar273 * auVar14._0_4_;
    auVar245._4_4_ = fVar218 * auVar14._4_4_;
    auVar245._8_4_ = fVar128 * auVar14._8_4_;
    auVar245._12_4_ = fVar129 * auVar14._12_4_;
    auVar245._16_4_ = fVar262 * auVar14._16_4_;
    auVar245._20_4_ = fVar263 * auVar14._20_4_;
    auVar245._24_4_ = fVar264 * auVar14._24_4_;
    auVar245._28_4_ = 0;
    auVar174 = vfmsub231ps_fma(auVar245,local_a60,local_5e0);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT1632(auVar174),ZEXT1632(auVar174));
    auVar112 = vmaxps_avx(ZEXT1632(CONCAT412(auVar96._12_4_ * auVar102._12_4_,
                                             CONCAT48(auVar96._8_4_ * auVar102._8_4_,
                                                      CONCAT44(auVar96._4_4_ * auVar102._4_4_,
                                                               auVar96._0_4_ * auVar102._0_4_)))),
                          ZEXT1632(CONCAT412(auVar133._12_4_ * auVar102._12_4_,
                                             CONCAT48(auVar133._8_4_ * auVar102._8_4_,
                                                      CONCAT44(auVar133._4_4_ * auVar102._4_4_,
                                                               auVar133._0_4_ * auVar102._0_4_)))));
    auVar231._0_4_ = auVar151._0_4_ + auVar207._0_4_;
    auVar231._4_4_ = auVar151._4_4_ + auVar207._4_4_;
    auVar231._8_4_ = auVar151._8_4_ + auVar207._8_4_;
    auVar231._12_4_ = auVar151._12_4_ + auVar207._12_4_;
    auVar231._16_4_ = auVar207._16_4_ + 0.0;
    auVar231._20_4_ = auVar207._20_4_ + 0.0;
    auVar231._24_4_ = auVar207._24_4_ + 0.0;
    local_7e0._28_4_ = 0;
    local_7e0._0_28_ = auVar231;
    auVar233._12_4_ = 0;
    auVar233._0_12_ = auVar231._16_12_;
    local_7c0 = ZEXT1632(auVar151);
    auVar145 = vsubps_avx(local_7c0,auVar207);
    auVar15 = vpermps_avx2(_DAT_01fec480,auVar145);
    auVar142 = vpermps_avx2(_DAT_01fec480,local_7c0);
    auVar145 = vmaxps_avx(local_7c0,local_7e0);
    auVar280 = vmaxps_avx(auVar15,auVar142);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar132));
    auVar145 = vmaxps_avx(auVar145,auVar280);
    fVar197 = auVar11._0_4_;
    fVar211 = auVar11._4_4_;
    fVar214 = auVar11._8_4_;
    fVar217 = auVar11._12_4_;
    fVar213 = auVar11._16_4_;
    fVar212 = auVar11._20_4_;
    fVar256 = auVar11._24_4_;
    auVar25._4_4_ = fVar211 * fVar211 * fVar211 * auVar132._4_4_ * -0.5;
    auVar25._0_4_ = fVar197 * fVar197 * fVar197 * auVar132._0_4_ * -0.5;
    auVar25._8_4_ = fVar214 * fVar214 * fVar214 * auVar132._8_4_ * -0.5;
    auVar25._12_4_ = fVar217 * fVar217 * fVar217 * auVar132._12_4_ * -0.5;
    auVar25._16_4_ = fVar213 * fVar213 * fVar213 * -0.0;
    auVar25._20_4_ = fVar212 * fVar212 * fVar212 * -0.0;
    auVar25._24_4_ = fVar256 * fVar256 * fVar256 * -0.0;
    auVar25._28_4_ = auVar15._28_4_;
    auVar138._8_4_ = 0x3fc00000;
    auVar138._0_8_ = 0x3fc000003fc00000;
    auVar138._12_4_ = 0x3fc00000;
    auVar138._16_4_ = 0x3fc00000;
    auVar138._20_4_ = 0x3fc00000;
    auVar138._24_4_ = 0x3fc00000;
    auVar138._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_fma(auVar25,auVar138,auVar11);
    auVar241 = ZEXT1664(auVar102);
    fVar211 = auVar102._0_4_;
    fVar217 = auVar102._4_4_;
    auVar26._4_4_ = fVar218 * fVar217;
    auVar26._0_4_ = fVar273 * fVar211;
    fVar256 = auVar102._8_4_;
    auVar26._8_4_ = fVar128 * fVar256;
    fVar273 = auVar102._12_4_;
    auVar26._12_4_ = fVar129 * fVar273;
    auVar26._16_4_ = fVar262 * 0.0;
    auVar26._20_4_ = fVar263 * 0.0;
    auVar26._24_4_ = fVar264 * 0.0;
    auVar26._28_4_ = 0;
    auVar27._4_4_ = (float)local_9a0._4_4_ * fVar215 * fVar217;
    auVar27._0_4_ = (float)local_9a0._0_4_ * fVar216 * fVar211;
    auVar27._8_4_ = fStack_998 * fVar219 * fVar256;
    auVar27._12_4_ = fStack_994 * fVar94 * fVar273;
    auVar27._16_4_ = fStack_990 * fVar125 * 0.0;
    auVar27._20_4_ = fStack_98c * fVar126 * 0.0;
    auVar27._24_4_ = fStack_988 * fVar127 * 0.0;
    auVar27._28_4_ = local_620._28_4_;
    auVar151 = vfmadd231ps_fma(auVar27,auVar26,_local_800);
    auVar280 = vsubps_avx(ZEXT832(0) << 0x20,auVar161);
    fVar214 = auVar280._0_4_;
    auVar294._0_4_ = fVar216 * fVar211 * fVar214;
    fVar213 = auVar280._4_4_;
    auVar294._4_4_ = fVar215 * fVar217 * fVar213;
    fVar216 = auVar280._8_4_;
    auVar294._8_4_ = fVar219 * fVar256 * fVar216;
    fVar219 = auVar280._12_4_;
    auVar294._12_4_ = fVar94 * fVar273 * fVar219;
    fVar94 = auVar280._16_4_;
    auVar294._16_4_ = fVar125 * 0.0 * fVar94;
    fVar125 = auVar280._20_4_;
    auVar294._20_4_ = fVar126 * 0.0 * fVar125;
    fVar126 = auVar280._24_4_;
    auVar294._24_4_ = fVar127 * 0.0 * fVar126;
    auVar294._28_4_ = 0;
    auVar280 = vsubps_avx(ZEXT832(0) << 0x20,local_980);
    auVar271 = ZEXT3264(auVar280);
    auVar132 = vfmadd231ps_fma(auVar294,auVar280,auVar26);
    auVar28._4_4_ = fVar266 * fVar217;
    auVar28._0_4_ = fVar265 * fVar211;
    auVar28._8_4_ = fVar272 * fVar256;
    auVar28._12_4_ = fVar290 * fVar273;
    auVar28._16_4_ = fVar291 * 0.0;
    auVar28._20_4_ = fVar292 * 0.0;
    auVar28._24_4_ = fVar293 * 0.0;
    auVar28._28_4_ = 0;
    auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar28,_local_820);
    auVar277 = ZEXT1664(auVar151);
    auVar252 = vsubps_avx(ZEXT832(0) << 0x20,auVar113);
    auVar283 = ZEXT3264(auVar252);
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar252,auVar28);
    auVar29._4_4_ = (float)local_9a0._4_4_ * fVar213;
    auVar29._0_4_ = (float)local_9a0._0_4_ * fVar214;
    auVar29._8_4_ = fStack_998 * fVar216;
    auVar29._12_4_ = fStack_994 * fVar219;
    auVar29._16_4_ = fStack_990 * fVar94;
    auVar29._20_4_ = fStack_98c * fVar125;
    auVar29._24_4_ = fStack_988 * fVar126;
    auVar29._28_4_ = 0;
    auVar96 = vfmadd231ps_fma(auVar29,_local_800,auVar280);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),_local_820,auVar252);
    fVar197 = auVar132._0_4_;
    fVar262 = auVar151._0_4_;
    fVar212 = auVar132._4_4_;
    fVar263 = auVar151._4_4_;
    fVar215 = auVar132._8_4_;
    fVar264 = auVar151._8_4_;
    fVar218 = auVar132._12_4_;
    fVar265 = auVar151._12_4_;
    auVar30._28_4_ = auVar11._28_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar265 * fVar218,
                            CONCAT48(fVar264 * fVar215,CONCAT44(fVar263 * fVar212,fVar262 * fVar197)
                                    )));
    auVar117 = vsubps_avx(ZEXT1632(auVar96),auVar30);
    auVar31._4_4_ = fVar213 * fVar213;
    auVar31._0_4_ = fVar214 * fVar214;
    auVar31._8_4_ = fVar216 * fVar216;
    auVar31._12_4_ = fVar219 * fVar219;
    auVar31._16_4_ = fVar94 * fVar94;
    auVar31._20_4_ = fVar125 * fVar125;
    auVar31._24_4_ = fVar126 * fVar126;
    auVar31._28_4_ = auVar11._28_4_;
    auVar96 = vfmadd231ps_fma(auVar31,auVar280,auVar280);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar252,auVar252);
    auVar32._28_4_ = local_600._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar218 * fVar218,
                            CONCAT48(fVar215 * fVar215,CONCAT44(fVar212 * fVar212,fVar197 * fVar197)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar96),auVar32);
    _local_680 = vsqrtps_avx(auVar112);
    fVar197 = (local_680._0_4_ + auVar145._0_4_) * 1.0000002;
    fVar212 = (local_680._4_4_ + auVar145._4_4_) * 1.0000002;
    fVar215 = (local_680._8_4_ + auVar145._8_4_) * 1.0000002;
    fVar218 = (local_680._12_4_ + auVar145._12_4_) * 1.0000002;
    fVar127 = (local_680._16_4_ + auVar145._16_4_) * 1.0000002;
    fVar128 = (local_680._20_4_ + auVar145._20_4_) * 1.0000002;
    fVar129 = (local_680._24_4_ + auVar145._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar212 * fVar212;
    auVar33._0_4_ = fVar197 * fVar197;
    auVar33._8_4_ = fVar215 * fVar215;
    auVar33._12_4_ = fVar218 * fVar218;
    auVar33._16_4_ = fVar127 * fVar127;
    auVar33._20_4_ = fVar128 * fVar128;
    auVar33._24_4_ = fVar129 * fVar129;
    auVar33._28_4_ = local_680._28_4_ + auVar145._28_4_;
    local_2a0._0_4_ = auVar117._0_4_ + auVar117._0_4_;
    local_2a0._4_4_ = auVar117._4_4_ + auVar117._4_4_;
    local_2a0._8_4_ = auVar117._8_4_ + auVar117._8_4_;
    local_2a0._12_4_ = auVar117._12_4_ + auVar117._12_4_;
    local_2a0._16_4_ = auVar117._16_4_ + auVar117._16_4_;
    local_2a0._20_4_ = auVar117._20_4_ + auVar117._20_4_;
    local_2a0._24_4_ = auVar117._24_4_ + auVar117._24_4_;
    local_2a0._28_4_ = auVar117._28_4_ + auVar117._28_4_;
    auVar145 = vsubps_avx(auVar11,auVar33);
    auVar276 = ZEXT1632(auVar151);
    local_640._28_4_ = 0x3f800002;
    local_640._0_28_ =
         ZEXT1628(CONCAT412(fVar265 * fVar265,
                            CONCAT48(fVar264 * fVar264,CONCAT44(fVar263 * fVar263,fVar262 * fVar262)
                                    )));
    local_6a0 = vsubps_avx(local_260,local_640);
    auVar246._0_4_ = local_2a0._0_4_ * local_2a0._0_4_;
    auVar246._4_4_ = local_2a0._4_4_ * local_2a0._4_4_;
    auVar246._8_4_ = local_2a0._8_4_ * local_2a0._8_4_;
    auVar246._12_4_ = local_2a0._12_4_ * local_2a0._12_4_;
    auVar246._16_4_ = local_2a0._16_4_ * local_2a0._16_4_;
    auVar246._20_4_ = local_2a0._20_4_ * local_2a0._20_4_;
    auVar246._24_4_ = local_2a0._24_4_ * local_2a0._24_4_;
    auVar246._28_4_ = 0;
    fVar212 = local_6a0._0_4_;
    fVar215 = local_6a0._4_4_;
    fStack_95c = fVar215 * 4.0;
    fVar218 = local_6a0._8_4_;
    fStack_958 = fVar218 * 4.0;
    fVar127 = local_6a0._12_4_;
    fStack_954 = fVar127 * 4.0;
    fVar128 = local_6a0._16_4_;
    fStack_950 = fVar128 * 4.0;
    fVar129 = local_6a0._20_4_;
    fStack_94c = fVar129 * 4.0;
    fVar262 = local_6a0._24_4_;
    fStack_948 = fVar262 * 4.0;
    uStack_944 = 0x40800000;
    auVar34._4_4_ = fStack_95c * auVar145._4_4_;
    auVar34._0_4_ = fVar212 * 4.0 * auVar145._0_4_;
    auVar34._8_4_ = fStack_958 * auVar145._8_4_;
    auVar34._12_4_ = fStack_954 * auVar145._12_4_;
    auVar34._16_4_ = fStack_950 * auVar145._16_4_;
    auVar34._20_4_ = fStack_94c * auVar145._20_4_;
    auVar34._24_4_ = fStack_948 * auVar145._24_4_;
    auVar34._28_4_ = 0x40800000;
    auVar117 = vsubps_avx(auVar246,auVar34);
    auVar112 = vcmpps_avx(auVar117,ZEXT432(0) << 0x20,5);
    auVar295 = ZEXT1632(auVar132);
    fVar197 = local_6a0._28_4_;
    if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0x7f,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar112 >> 0xbf,0) == '\0') &&
        (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar112[0x1f])
    {
      auVar247._8_4_ = 0x7f800000;
      auVar247._0_8_ = 0x7f8000007f800000;
      auVar247._12_4_ = 0x7f800000;
      auVar247._16_4_ = 0x7f800000;
      auVar247._20_4_ = 0x7f800000;
      auVar247._24_4_ = 0x7f800000;
      auVar247._28_4_ = 0x7f800000;
      auVar191._8_4_ = 0xff800000;
      auVar191._0_8_ = 0xff800000ff800000;
      auVar191._12_4_ = 0xff800000;
      auVar191._16_4_ = 0xff800000;
      auVar191._20_4_ = 0xff800000;
      auVar191._24_4_ = 0xff800000;
      auVar191._28_4_ = 0xff800000;
    }
    else {
      auVar12 = vsqrtps_avx(auVar117);
      auVar284._0_4_ = fVar212 + fVar212;
      auVar284._4_4_ = fVar215 + fVar215;
      auVar284._8_4_ = fVar218 + fVar218;
      auVar284._12_4_ = fVar127 + fVar127;
      auVar284._16_4_ = fVar128 + fVar128;
      auVar284._20_4_ = fVar129 + fVar129;
      auVar284._24_4_ = fVar262 + fVar262;
      auVar284._28_4_ = fVar197 + fVar197;
      auVar209 = vrcpps_avx(auVar284);
      auVar238 = vcmpps_avx(auVar117,ZEXT432(0) << 0x20,5);
      auVar192._8_4_ = 0x3f800000;
      auVar192._0_8_ = 0x3f8000003f800000;
      auVar192._12_4_ = 0x3f800000;
      auVar192._16_4_ = 0x3f800000;
      auVar192._20_4_ = 0x3f800000;
      auVar192._24_4_ = 0x3f800000;
      auVar192._28_4_ = 0x3f800000;
      auVar151 = vfnmadd213ps_fma(auVar284,auVar209,auVar192);
      auVar151 = vfmadd132ps_fma(ZEXT1632(auVar151),auVar209,auVar209);
      auVar193._0_4_ = (uint)local_2a0._0_4_ ^ local_660;
      auVar193._4_4_ = (uint)local_2a0._4_4_ ^ uStack_65c;
      auVar193._8_4_ = (uint)local_2a0._8_4_ ^ uStack_658;
      auVar193._12_4_ = (uint)local_2a0._12_4_ ^ uStack_654;
      auVar193._16_4_ = (uint)local_2a0._16_4_ ^ (uint)fStack_650;
      auVar193._20_4_ = (uint)local_2a0._20_4_ ^ (uint)fStack_64c;
      auVar193._24_4_ = (uint)local_2a0._24_4_ ^ (uint)fStack_648;
      auVar193._28_4_ = (uint)local_2a0._28_4_ ^ uStack_644;
      auVar117 = vsubps_avx(auVar193,auVar12);
      auVar35._4_4_ = auVar151._4_4_ * auVar117._4_4_;
      auVar35._0_4_ = auVar151._0_4_ * auVar117._0_4_;
      auVar35._8_4_ = auVar151._8_4_ * auVar117._8_4_;
      auVar35._12_4_ = auVar151._12_4_ * auVar117._12_4_;
      auVar35._16_4_ = auVar117._16_4_ * 0.0;
      auVar35._20_4_ = auVar117._20_4_ * 0.0;
      auVar35._24_4_ = auVar117._24_4_ * 0.0;
      auVar35._28_4_ = auVar117._28_4_;
      auVar117 = vsubps_avx(auVar12,local_2a0);
      auVar36._4_4_ = auVar151._4_4_ * auVar117._4_4_;
      auVar36._0_4_ = auVar151._0_4_ * auVar117._0_4_;
      auVar36._8_4_ = auVar151._8_4_ * auVar117._8_4_;
      auVar36._12_4_ = auVar151._12_4_ * auVar117._12_4_;
      auVar36._16_4_ = auVar117._16_4_ * 0.0;
      auVar36._20_4_ = auVar117._20_4_ * 0.0;
      auVar36._24_4_ = auVar117._24_4_ * 0.0;
      auVar36._28_4_ = auVar117._28_4_;
      auVar151 = vfmadd213ps_fma(auVar276,auVar35,auVar295);
      local_320 = auVar151._0_4_ * fVar211;
      fStack_31c = auVar151._4_4_ * fVar217;
      fStack_318 = auVar151._8_4_ * fVar256;
      fStack_314 = auVar151._12_4_ * fVar273;
      uStack_310 = 0;
      uStack_30c = 0;
      uStack_308 = 0;
      fStack_304 = local_2a0._28_4_;
      auVar57._4_4_ = uStack_85c;
      auVar57._0_4_ = local_860;
      auVar57._8_4_ = uStack_858;
      auVar57._12_4_ = uStack_854;
      auVar57._16_4_ = uStack_850;
      auVar57._20_4_ = uStack_84c;
      auVar57._24_4_ = uStack_848;
      auVar57._28_4_ = uStack_844;
      auVar117 = vandps_avx(local_640,auVar57);
      auVar117 = vmaxps_avx(local_560,auVar117);
      auVar37._4_4_ = auVar117._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar117._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar117._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar117._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar117._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar117._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar117._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar117._28_4_;
      auVar117 = vandps_avx(local_6a0,auVar57);
      auVar117 = vcmpps_avx(auVar117,auVar37,1);
      auVar151 = vfmadd213ps_fma(auVar276,auVar36,auVar295);
      auVar139._8_4_ = 0x7f800000;
      auVar139._0_8_ = 0x7f8000007f800000;
      auVar139._12_4_ = 0x7f800000;
      auVar139._16_4_ = 0x7f800000;
      auVar139._20_4_ = 0x7f800000;
      auVar139._24_4_ = 0x7f800000;
      auVar139._28_4_ = 0x7f800000;
      auVar247 = vblendvps_avx(auVar139,auVar35,auVar238);
      local_340 = auVar151._0_4_ * fVar211;
      fStack_33c = auVar151._4_4_ * fVar217;
      fStack_338 = auVar151._8_4_ * fVar256;
      fStack_334 = auVar151._12_4_ * fVar273;
      uStack_330 = 0;
      uStack_32c = 0;
      uStack_328 = 0;
      uStack_324 = auVar247._28_4_;
      auVar140._8_4_ = 0xff800000;
      auVar140._0_8_ = 0xff800000ff800000;
      auVar140._12_4_ = 0xff800000;
      auVar140._16_4_ = 0xff800000;
      auVar140._20_4_ = 0xff800000;
      auVar140._24_4_ = 0xff800000;
      auVar140._28_4_ = 0xff800000;
      auVar191 = vblendvps_avx(auVar140,auVar36,auVar238);
      auVar209 = auVar238 & auVar117;
      if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar209 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar209 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar209 >> 0x7f,0) != '\0') ||
            (auVar209 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar209 >> 0xbf,0) != '\0') ||
          (auVar209 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar209[0x1f] < '\0') {
        auVar112 = vandps_avx(auVar117,auVar238);
        auVar117 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,2);
        auVar241 = ZEXT3264(auVar117);
        auVar148._8_4_ = 0xff800000;
        auVar148._0_8_ = 0xff800000ff800000;
        auVar148._12_4_ = 0xff800000;
        auVar148._16_4_ = 0xff800000;
        auVar148._20_4_ = 0xff800000;
        auVar148._24_4_ = 0xff800000;
        auVar148._28_4_ = 0xff800000;
        auVar228._8_4_ = 0x7f800000;
        auVar228._0_8_ = 0x7f8000007f800000;
        auVar228._12_4_ = 0x7f800000;
        auVar228._16_4_ = 0x7f800000;
        auVar228._20_4_ = 0x7f800000;
        auVar228._24_4_ = 0x7f800000;
        auVar228._28_4_ = 0x7f800000;
        auVar145 = vblendvps_avx(auVar228,auVar148,auVar117);
        auVar151 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
        auVar209 = vpmovsxwd_avx2(auVar151);
        auVar247 = vblendvps_avx(auVar247,auVar145,auVar209);
        auVar145 = vblendvps_avx(auVar148,auVar228,auVar117);
        auVar191 = vblendvps_avx(auVar191,auVar145,auVar209);
        auVar210._0_8_ = auVar112._0_8_ ^ 0xffffffffffffffff;
        auVar210._8_4_ = auVar112._8_4_ ^ 0xffffffff;
        auVar210._12_4_ = auVar112._12_4_ ^ 0xffffffff;
        auVar210._16_4_ = auVar112._16_4_ ^ 0xffffffff;
        auVar210._20_4_ = auVar112._20_4_ ^ 0xffffffff;
        auVar210._24_4_ = auVar112._24_4_ ^ 0xffffffff;
        auVar210._28_4_ = auVar112._28_4_ ^ 0xffffffff;
        auVar112 = vorps_avx(auVar117,auVar210);
        auVar112 = vandps_avx(auVar238,auVar112);
      }
    }
    auVar260 = ZEXT1664(auVar102);
    auVar145 = local_2c0 & auVar112;
    if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar145 >> 0x7f,0) != '\0') ||
          (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar145 >> 0xbf,0) != '\0') ||
        (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar145[0x1f] < '\0') {
      local_360 = ZEXT1632(auVar102);
      fVar263 = *(float *)(ray + k * 4 + 0x80);
      local_590 = ZEXT416((uint)fVar263);
      fVar264 = fVar263 - (float)local_8d0._0_4_;
      auVar208._4_4_ = fVar264;
      auVar208._0_4_ = fVar264;
      auVar208._8_4_ = fVar264;
      auVar208._12_4_ = fVar264;
      auVar208._16_4_ = fVar264;
      auVar208._20_4_ = fVar264;
      auVar208._24_4_ = fVar264;
      auVar208._28_4_ = fVar264;
      local_300 = vminps_avx(auVar208,auVar191);
      auVar38._4_4_ = fVar150 * fVar213;
      auVar38._0_4_ = fVar130 * fVar214;
      auVar38._8_4_ = fVar171 * fVar216;
      auVar38._12_4_ = fVar172 * fVar219;
      auVar38._16_4_ = fVar173 * fVar94;
      auVar38._20_4_ = fVar257 * fVar125;
      auVar38._24_4_ = fVar261 * fVar126;
      auVar38._28_4_ = fVar264;
      auVar102 = vfmadd213ps_fma(auVar280,local_a20,auVar38);
      auVar77._4_4_ = fStack_2dc;
      auVar77._0_4_ = local_2e0;
      auVar77._8_4_ = fStack_2d8;
      auVar77._12_4_ = fStack_2d4;
      auVar77._16_4_ = fStack_2d0;
      auVar77._20_4_ = fStack_2cc;
      auVar77._24_4_ = fStack_2c8;
      auVar77._28_4_ = fStack_2c4;
      auVar117 = vmaxps_avx(auVar77,auVar247);
      auVar151 = vfmadd213ps_fma(auVar252,local_b00,ZEXT1632(auVar102));
      auVar39._4_4_ = (float)local_9a0._4_4_ * fVar150;
      auVar39._0_4_ = (float)local_9a0._0_4_ * fVar130;
      auVar39._8_4_ = fStack_998 * fVar171;
      auVar39._12_4_ = fStack_994 * fVar172;
      auVar39._16_4_ = fStack_990 * fVar173;
      auVar39._20_4_ = fStack_98c * fVar257;
      auVar39._24_4_ = fStack_988 * fVar261;
      auVar39._28_4_ = uVar93;
      auVar260 = ZEXT3264(_local_800);
      auVar102 = vfmadd231ps_fma(auVar39,_local_800,local_a20);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar102),_local_820,local_b00);
      auVar58._4_4_ = uStack_85c;
      auVar58._0_4_ = local_860;
      auVar58._8_4_ = uStack_858;
      auVar58._12_4_ = uStack_854;
      auVar58._16_4_ = uStack_850;
      auVar58._20_4_ = uStack_84c;
      auVar58._24_4_ = uStack_848;
      auVar58._28_4_ = uStack_844;
      auVar145 = vandps_avx(auVar58,ZEXT1632(auVar132));
      auVar141._8_4_ = 0x219392ef;
      auVar141._0_8_ = 0x219392ef219392ef;
      auVar141._12_4_ = 0x219392ef;
      auVar141._16_4_ = 0x219392ef;
      auVar141._20_4_ = 0x219392ef;
      auVar141._24_4_ = 0x219392ef;
      auVar141._28_4_ = 0x219392ef;
      auVar280 = vcmpps_avx(auVar145,auVar141,1);
      auVar145 = vrcpps_avx(ZEXT1632(auVar132));
      auVar162._8_4_ = 0x3f800000;
      auVar162._0_8_ = 0x3f8000003f800000;
      auVar162._12_4_ = 0x3f800000;
      auVar162._16_4_ = 0x3f800000;
      auVar162._20_4_ = 0x3f800000;
      auVar162._24_4_ = 0x3f800000;
      auVar162._28_4_ = 0x3f800000;
      auVar238 = ZEXT1632(auVar132);
      auVar102 = vfnmadd213ps_fma(auVar145,auVar238,auVar162);
      auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar145,auVar145);
      auVar285._0_4_ = auVar132._0_4_ ^ local_660;
      auVar285._4_4_ = auVar132._4_4_ ^ uStack_65c;
      auVar285._8_4_ = auVar132._8_4_ ^ uStack_658;
      auVar285._12_4_ = auVar132._12_4_ ^ uStack_654;
      auVar285._16_4_ = fStack_650;
      auVar285._20_4_ = fStack_64c;
      auVar285._24_4_ = fStack_648;
      auVar285._28_4_ = uStack_644;
      auVar40._4_4_ = auVar102._4_4_ * (float)(auVar151._4_4_ ^ uStack_65c);
      auVar40._0_4_ = auVar102._0_4_ * (float)(auVar151._0_4_ ^ local_660);
      auVar40._8_4_ = auVar102._8_4_ * (float)(auVar151._8_4_ ^ uStack_658);
      auVar40._12_4_ = auVar102._12_4_ * (float)(auVar151._12_4_ ^ uStack_654);
      auVar40._16_4_ = fStack_650 * 0.0;
      auVar40._20_4_ = fStack_64c * 0.0;
      auVar40._24_4_ = fStack_648 * 0.0;
      auVar40._28_4_ = uStack_644;
      auVar145 = vcmpps_avx(auVar238,auVar285,1);
      auVar145 = vorps_avx(auVar280,auVar145);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar145 = vblendvps_avx(auVar40,auVar279,auVar145);
      auVar252 = vmaxps_avx(auVar117,auVar145);
      auVar145 = vcmpps_avx(auVar238,auVar285,6);
      auVar145 = vorps_avx(auVar280,auVar145);
      auVar286._8_4_ = 0x7f800000;
      auVar286._0_8_ = 0x7f8000007f800000;
      auVar286._12_4_ = 0x7f800000;
      auVar286._16_4_ = 0x7f800000;
      auVar286._20_4_ = 0x7f800000;
      auVar286._24_4_ = 0x7f800000;
      auVar286._28_4_ = 0x7f800000;
      auVar145 = vblendvps_avx(auVar40,auVar286,auVar145);
      auVar117 = vminps_avx(local_300,auVar145);
      local_a80._28_4_ = auVar14._28_4_;
      fVar214 = (float)(local_660 ^ (uint)auVar14._0_4_);
      fVar213 = (float)(uStack_65c ^ (uint)auVar14._4_4_);
      fVar216 = (float)(uStack_658 ^ (uint)auVar14._8_4_);
      fVar219 = (float)(uStack_654 ^ (uint)auVar14._12_4_);
      fVar94 = (float)((uint)fStack_650 ^ (uint)auVar14._16_4_);
      fVar125 = (float)((uint)fStack_64c ^ (uint)auVar14._20_4_);
      fVar126 = (float)((uint)fStack_648 ^ (uint)auVar14._24_4_);
      auVar239._0_4_ = local_660 ^ (uint)local_a60._0_4_;
      auVar239._4_4_ = uStack_65c ^ (uint)local_a60._4_4_;
      auVar239._8_4_ = uStack_658 ^ (uint)local_a60._8_4_;
      auVar239._12_4_ = uStack_654 ^ (uint)local_a60._12_4_;
      auVar239._16_4_ = (uint)fStack_650 ^ (uint)local_a60._16_4_;
      auVar239._20_4_ = (uint)fStack_64c ^ (uint)local_a60._20_4_;
      auVar239._24_4_ = (uint)fStack_648 ^ (uint)local_a60._24_4_;
      auVar239._28_4_ = uStack_644 ^ local_a60._28_4_;
      auVar280 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar145 = vsubps_avx(auVar280,local_ae0);
      auVar280 = vsubps_avx(auVar280,local_780);
      auVar41._4_4_ = auVar280._4_4_ * fVar213;
      auVar41._0_4_ = auVar280._0_4_ * fVar214;
      auVar41._8_4_ = auVar280._8_4_ * fVar216;
      auVar41._12_4_ = auVar280._12_4_ * fVar219;
      auVar41._16_4_ = auVar280._16_4_ * fVar94;
      auVar41._20_4_ = auVar280._20_4_ * fVar125;
      auVar41._24_4_ = auVar280._24_4_ * fVar126;
      auVar41._28_4_ = auVar280._28_4_;
      auVar102 = vfmadd231ps_fma(auVar41,auVar239,auVar145);
      auVar248._0_4_ = local_660 ^ (uint)local_a40._0_4_;
      auVar248._4_4_ = uStack_65c ^ (uint)local_a40._4_4_;
      auVar248._8_4_ = uStack_658 ^ (uint)local_a40._8_4_;
      auVar248._12_4_ = uStack_654 ^ (uint)local_a40._12_4_;
      auVar248._16_4_ = (uint)fStack_650 ^ (uint)local_a40._16_4_;
      auVar248._20_4_ = (uint)fStack_64c ^ (uint)local_a40._20_4_;
      auVar248._24_4_ = (uint)fStack_648 ^ (uint)local_a40._24_4_;
      auVar248._28_4_ = uStack_644 ^ local_a40._28_4_;
      auVar145 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar13);
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar248,auVar145);
      auVar42._4_4_ = (float)local_9a0._4_4_ * fVar213;
      auVar42._0_4_ = (float)local_9a0._0_4_ * fVar214;
      auVar42._8_4_ = fStack_998 * fVar216;
      auVar42._12_4_ = fStack_994 * fVar219;
      auVar42._16_4_ = fStack_990 * fVar94;
      auVar42._20_4_ = fStack_98c * fVar125;
      auVar42._24_4_ = fStack_988 * fVar126;
      auVar42._28_4_ = uStack_644 ^ local_a80._28_4_;
      auVar102 = vfmadd231ps_fma(auVar42,_local_800,auVar239);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar102),_local_820,auVar248);
      auVar145 = vandps_avx(auVar58,ZEXT1632(auVar132));
      auVar238 = vrcpps_avx(ZEXT1632(auVar132));
      auVar194._8_4_ = 0x219392ef;
      auVar194._0_8_ = 0x219392ef219392ef;
      auVar194._12_4_ = 0x219392ef;
      auVar194._16_4_ = 0x219392ef;
      auVar194._20_4_ = 0x219392ef;
      auVar194._24_4_ = 0x219392ef;
      auVar194._28_4_ = 0x219392ef;
      auVar280 = vcmpps_avx(auVar145,auVar194,1);
      auVar241 = ZEXT3264(auVar280);
      auVar209 = ZEXT1632(auVar132);
      auVar102 = vfnmadd213ps_fma(auVar238,auVar209,auVar162);
      auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar238,auVar238);
      auVar249._0_4_ = auVar132._0_4_ ^ local_660;
      auVar249._4_4_ = auVar132._4_4_ ^ uStack_65c;
      auVar249._8_4_ = auVar132._8_4_ ^ uStack_658;
      auVar249._12_4_ = auVar132._12_4_ ^ uStack_654;
      auVar249._16_4_ = fStack_650;
      auVar249._20_4_ = fStack_64c;
      auVar249._24_4_ = fStack_648;
      auVar249._28_4_ = uStack_644;
      auVar43._4_4_ = auVar102._4_4_ * (float)(auVar151._4_4_ ^ uStack_65c);
      auVar43._0_4_ = auVar102._0_4_ * (float)(auVar151._0_4_ ^ local_660);
      auVar43._8_4_ = auVar102._8_4_ * (float)(auVar151._8_4_ ^ uStack_658);
      auVar43._12_4_ = auVar102._12_4_ * (float)(auVar151._12_4_ ^ uStack_654);
      auVar43._16_4_ = fStack_650 * 0.0;
      auVar43._20_4_ = fStack_64c * 0.0;
      auVar43._24_4_ = fStack_648 * 0.0;
      auVar43._28_4_ = uStack_644;
      auVar271 = ZEXT3264(auVar43);
      auVar145 = vcmpps_avx(auVar209,auVar249,1);
      auVar145 = vorps_avx(auVar145,auVar280);
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar145 = vblendvps_avx(auVar43,auVar115,auVar145);
      auVar283 = ZEXT3264(auVar145);
      _local_9e0 = vmaxps_avx(auVar252,auVar145);
      auVar145 = vcmpps_avx(auVar209,auVar249,6);
      auVar145 = vorps_avx(auVar280,auVar145);
      auVar116._8_4_ = 0x7f800000;
      auVar116._0_8_ = 0x7f8000007f800000;
      auVar116._12_4_ = 0x7f800000;
      auVar116._16_4_ = 0x7f800000;
      auVar116._20_4_ = 0x7f800000;
      auVar116._24_4_ = 0x7f800000;
      auVar116._28_4_ = 0x7f800000;
      auVar145 = vblendvps_avx(auVar43,auVar116,auVar145);
      auVar112 = vandps_avx(local_2c0,auVar112);
      local_380 = vminps_avx(auVar117,auVar145);
      auVar145 = vcmpps_avx(_local_9e0,local_380,2);
      auVar280 = auVar112 & auVar145;
      if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar280 >> 0x7f,0) != '\0') ||
            (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar280 >> 0xbf,0) != '\0') ||
          (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar280[0x1f] < '\0') {
        auVar76._4_4_ = fStack_31c;
        auVar76._0_4_ = local_320;
        auVar76._8_4_ = fStack_318;
        auVar76._12_4_ = fStack_314;
        auVar76._16_4_ = uStack_310;
        auVar76._20_4_ = uStack_30c;
        auVar76._24_4_ = uStack_308;
        auVar76._28_4_ = fStack_304;
        auVar280 = vminps_avx(auVar76,auVar162);
        auVar283 = ZEXT864(0) << 0x20;
        auVar280 = vmaxps_avx(auVar280,ZEXT832(0) << 0x20);
        auVar75._4_4_ = fStack_33c;
        auVar75._0_4_ = local_340;
        auVar75._8_4_ = fStack_338;
        auVar75._12_4_ = fStack_334;
        auVar75._16_4_ = uStack_330;
        auVar75._20_4_ = uStack_32c;
        auVar75._24_4_ = uStack_328;
        auVar75._28_4_ = uStack_324;
        auVar252 = vminps_avx(auVar75,auVar162);
        auVar252 = vmaxps_avx(auVar252,ZEXT832(0) << 0x20);
        auVar44._4_4_ = (auVar280._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar280._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar280._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar280._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar280._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar280._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar280._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar280._28_4_ + 7.0;
        auVar102 = vfmadd213ps_fma(auVar44,local_7a0,local_940);
        auVar45._4_4_ = (auVar252._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar252._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar252._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar252._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar252._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar252._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar252._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar252._28_4_ + 7.0;
        auVar151 = vfmadd213ps_fma(auVar45,local_7a0,local_940);
        auVar280 = vminps_avx(local_7c0,local_7e0);
        auVar252 = vminps_avx(auVar15,auVar142);
        auVar280 = vminps_avx(auVar280,auVar252);
        auVar280 = vsubps_avx(auVar280,_local_680);
        auVar112 = vandps_avx(auVar145,auVar112);
        local_1a0 = ZEXT1632(auVar102);
        local_1c0 = ZEXT1632(auVar151);
        auVar46._4_4_ = auVar280._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar280._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar280._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar280._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar280._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar280._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar280._24_4_ * 0.99999976;
        auVar46._28_4_ = auVar280._28_4_;
        auVar145 = vmaxps_avx(ZEXT832(0) << 0x20,auVar46);
        auVar47._4_4_ = auVar145._4_4_ * auVar145._4_4_;
        auVar47._0_4_ = auVar145._0_4_ * auVar145._0_4_;
        auVar47._8_4_ = auVar145._8_4_ * auVar145._8_4_;
        auVar47._12_4_ = auVar145._12_4_ * auVar145._12_4_;
        auVar47._16_4_ = auVar145._16_4_ * auVar145._16_4_;
        auVar47._20_4_ = auVar145._20_4_ * auVar145._20_4_;
        auVar47._24_4_ = auVar145._24_4_ * auVar145._24_4_;
        auVar47._28_4_ = auVar145._28_4_;
        auVar280 = vsubps_avx(auVar11,auVar47);
        auVar48._4_4_ = auVar280._4_4_ * fStack_95c;
        auVar48._0_4_ = auVar280._0_4_ * fVar212 * 4.0;
        auVar48._8_4_ = auVar280._8_4_ * fStack_958;
        auVar48._12_4_ = auVar280._12_4_ * fStack_954;
        auVar48._16_4_ = auVar280._16_4_ * fStack_950;
        auVar48._20_4_ = auVar280._20_4_ * fStack_94c;
        auVar48._24_4_ = auVar280._24_4_ * fStack_948;
        auVar48._28_4_ = auVar145._28_4_;
        auVar11 = vsubps_avx(auVar246,auVar48);
        auVar271 = ZEXT3264(auVar11);
        _local_ac0 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
        auVar145 = _local_ac0;
        if ((((((((_local_ac0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_ac0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_ac0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_ac0 >> 0x7f,0) == '\0') &&
              (_local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_ac0 >> 0xbf,0) == '\0') &&
            (_local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_ac0[0x1f]) {
          auVar117 = SUB6432(ZEXT864(0),0) << 0x20;
          local_8a0 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar142 = ZEXT832(0) << 0x20;
          auVar169 = ZEXT864(0) << 0x20;
          auVar240._8_4_ = 0x7f800000;
          auVar240._0_8_ = 0x7f8000007f800000;
          auVar240._12_4_ = 0x7f800000;
          auVar240._16_4_ = 0x7f800000;
          auVar240._20_4_ = 0x7f800000;
          auVar240._24_4_ = 0x7f800000;
          auVar240._28_4_ = 0x7f800000;
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          _local_ac0 = auVar13;
          local_880 = local_8a0;
        }
        else {
          auVar117 = vsqrtps_avx(auVar11);
          auVar251._0_4_ = fVar212 + fVar212;
          auVar251._4_4_ = fVar215 + fVar215;
          auVar251._8_4_ = fVar218 + fVar218;
          auVar251._12_4_ = fVar127 + fVar127;
          auVar251._16_4_ = fVar128 + fVar128;
          auVar251._20_4_ = fVar129 + fVar129;
          auVar251._24_4_ = fVar262 + fVar262;
          auVar251._28_4_ = fVar197 + fVar197;
          auVar252 = vrcpps_avx(auVar251);
          auVar102 = vfnmadd213ps_fma(auVar251,auVar252,auVar162);
          auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar252,auVar252);
          auVar281._0_4_ = (uint)local_2a0._0_4_ ^ local_660;
          auVar281._4_4_ = (uint)local_2a0._4_4_ ^ uStack_65c;
          auVar281._8_4_ = (uint)local_2a0._8_4_ ^ uStack_658;
          auVar281._12_4_ = (uint)local_2a0._12_4_ ^ uStack_654;
          auVar281._16_4_ = (uint)local_2a0._16_4_ ^ (uint)fStack_650;
          auVar281._20_4_ = (uint)local_2a0._20_4_ ^ (uint)fStack_64c;
          auVar281._24_4_ = (uint)local_2a0._24_4_ ^ (uint)fStack_648;
          auVar281._28_4_ = (uint)local_2a0._28_4_ ^ uStack_644;
          auVar252 = vsubps_avx(auVar281,auVar117);
          auVar13 = vsubps_avx(auVar117,local_2a0);
          fVar197 = auVar252._0_4_ * auVar102._0_4_;
          fVar214 = auVar252._4_4_ * auVar102._4_4_;
          auVar49._4_4_ = fVar214;
          auVar49._0_4_ = fVar197;
          fVar213 = auVar252._8_4_ * auVar102._8_4_;
          auVar49._8_4_ = fVar213;
          fVar212 = auVar252._12_4_ * auVar102._12_4_;
          auVar49._12_4_ = fVar212;
          fVar216 = auVar252._16_4_ * 0.0;
          auVar49._16_4_ = fVar216;
          fVar215 = auVar252._20_4_ * 0.0;
          auVar49._20_4_ = fVar215;
          fVar219 = auVar252._24_4_ * 0.0;
          auVar49._24_4_ = fVar219;
          auVar49._28_4_ = auVar117._28_4_;
          fVar218 = auVar102._0_4_ * auVar13._0_4_;
          fVar94 = auVar102._4_4_ * auVar13._4_4_;
          auVar50._4_4_ = fVar94;
          auVar50._0_4_ = fVar218;
          fVar125 = auVar102._8_4_ * auVar13._8_4_;
          auVar50._8_4_ = fVar125;
          fVar126 = auVar102._12_4_ * auVar13._12_4_;
          auVar50._12_4_ = fVar126;
          fVar127 = auVar13._16_4_ * 0.0;
          auVar50._16_4_ = fVar127;
          fVar128 = auVar13._20_4_ * 0.0;
          auVar50._20_4_ = fVar128;
          fVar129 = auVar13._24_4_ * 0.0;
          auVar50._24_4_ = fVar129;
          auVar50._28_4_ = auVar252._28_4_;
          auVar283 = ZEXT3264(auVar50);
          auVar102 = vfmadd213ps_fma(auVar276,auVar49,auVar295);
          auVar151 = vfmadd213ps_fma(auVar276,auVar50,auVar295);
          auVar252 = ZEXT1632(CONCAT412(auVar102._12_4_ * fVar273,
                                        CONCAT48(auVar102._8_4_ * fVar256,
                                                 CONCAT44(auVar102._4_4_ * fVar217,
                                                          auVar102._0_4_ * fVar211))));
          auVar51._28_4_ = local_800._28_4_;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(auVar151._12_4_ * fVar273,
                                  CONCAT48(auVar151._8_4_ * fVar256,
                                           CONCAT44(auVar151._4_4_ * fVar217,
                                                    auVar151._0_4_ * fVar211))));
          auVar102 = vfmadd213ps_fma(local_600,auVar252,auVar113);
          auVar151 = vfmadd213ps_fma(local_600,auVar51,auVar113);
          auVar132 = vfmadd213ps_fma(local_620,auVar252,local_980);
          auVar96 = vfmadd213ps_fma(local_620,auVar51,local_980);
          auVar133 = vfmadd213ps_fma(auVar252,local_5e0,auVar161);
          auVar174 = vfmadd213ps_fma(local_5e0,auVar51,auVar161);
          auVar52._4_4_ = (float)local_820._4_4_ * fVar214;
          auVar52._0_4_ = (float)local_820._0_4_ * fVar197;
          auVar52._8_4_ = fStack_818 * fVar213;
          auVar52._12_4_ = fStack_814 * fVar212;
          auVar52._16_4_ = fStack_810 * fVar216;
          auVar52._20_4_ = fStack_80c * fVar215;
          auVar52._24_4_ = fStack_808 * fVar219;
          auVar52._28_4_ = 0;
          auVar117 = vsubps_avx(auVar52,ZEXT1632(auVar102));
          auVar53._4_4_ = (float)local_800._4_4_ * fVar214;
          auVar53._0_4_ = (float)local_800._0_4_ * fVar197;
          auVar53._8_4_ = fStack_7f8 * fVar213;
          auVar53._12_4_ = fStack_7f4 * fVar212;
          auVar53._16_4_ = fStack_7f0 * fVar216;
          auVar53._20_4_ = fStack_7ec * fVar215;
          auVar53._24_4_ = fStack_7e8 * fVar219;
          auVar53._28_4_ = 0x3e000000;
          auVar142 = vsubps_avx(auVar53,ZEXT1632(auVar132));
          auVar163._0_4_ = (float)local_9a0._0_4_ * fVar197;
          auVar163._4_4_ = (float)local_9a0._4_4_ * fVar214;
          auVar163._8_4_ = fStack_998 * fVar213;
          auVar163._12_4_ = fStack_994 * fVar212;
          auVar163._16_4_ = fStack_990 * fVar216;
          auVar163._20_4_ = fStack_98c * fVar215;
          auVar163._24_4_ = fStack_988 * fVar219;
          auVar163._28_4_ = 0;
          auVar252 = vsubps_avx(auVar163,ZEXT1632(auVar133));
          auVar169 = ZEXT3264(auVar252);
          auVar253._0_4_ = (float)local_820._0_4_ * fVar218;
          auVar253._4_4_ = (float)local_820._4_4_ * fVar94;
          auVar253._8_4_ = fStack_818 * fVar125;
          auVar253._12_4_ = fStack_814 * fVar126;
          auVar253._16_4_ = fStack_810 * fVar127;
          auVar253._20_4_ = fStack_80c * fVar128;
          auVar253._24_4_ = fStack_808 * fVar129;
          auVar253._28_4_ = 0;
          local_880 = vsubps_avx(auVar253,ZEXT1632(auVar151));
          auVar54._4_4_ = (float)local_800._4_4_ * fVar94;
          auVar54._0_4_ = (float)local_800._0_4_ * fVar218;
          auVar54._8_4_ = fStack_7f8 * fVar125;
          auVar54._12_4_ = fStack_7f4 * fVar126;
          auVar54._16_4_ = fStack_7f0 * fVar127;
          auVar54._20_4_ = fStack_7ec * fVar128;
          auVar54._24_4_ = fStack_7e8 * fVar129;
          auVar54._28_4_ = local_880._28_4_;
          local_8a0 = vsubps_avx(auVar54,ZEXT1632(auVar96));
          auVar55._4_4_ = (float)local_9a0._4_4_ * fVar94;
          auVar55._0_4_ = (float)local_9a0._0_4_ * fVar218;
          auVar55._8_4_ = fStack_998 * fVar125;
          auVar55._12_4_ = fStack_994 * fVar126;
          auVar55._16_4_ = fStack_990 * fVar127;
          auVar55._20_4_ = fStack_98c * fVar128;
          auVar55._24_4_ = fStack_988 * fVar129;
          auVar55._28_4_ = local_8a0._28_4_;
          _local_680 = vsubps_avx(auVar55,ZEXT1632(auVar174));
          auVar277 = ZEXT864(0) << 0x20;
          auVar252 = vcmpps_avx(auVar11,_DAT_01faff00,5);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar240 = vblendvps_avx(auVar254,auVar49,auVar252);
          auVar59._4_4_ = uStack_85c;
          auVar59._0_4_ = local_860;
          auVar59._8_4_ = uStack_858;
          auVar59._12_4_ = uStack_854;
          auVar59._16_4_ = uStack_850;
          auVar59._20_4_ = uStack_84c;
          auVar59._24_4_ = uStack_848;
          auVar59._28_4_ = uStack_844;
          auVar11 = vandps_avx(auVar59,local_640);
          auVar11 = vmaxps_avx(local_560,auVar11);
          auVar56._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar56._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar56._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar56._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar56._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar56._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar56._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar56._28_4_ = auVar11._28_4_;
          auVar11 = vandps_avx(auVar59,local_6a0);
          auVar11 = vcmpps_avx(auVar11,auVar56,1);
          auVar271 = ZEXT3264(auVar11);
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar250 = vblendvps_avx(auVar255,auVar50,auVar252);
          auVar13 = auVar252 & auVar11;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar145 = vandps_avx(auVar11,auVar252);
            auVar11 = vcmpps_avx(auVar280,ZEXT832(0) << 0x20,2);
            auVar282._8_4_ = 0xff800000;
            auVar282._0_8_ = 0xff800000ff800000;
            auVar282._12_4_ = 0xff800000;
            auVar282._16_4_ = 0xff800000;
            auVar282._20_4_ = 0xff800000;
            auVar282._24_4_ = 0xff800000;
            auVar282._28_4_ = 0xff800000;
            auVar283 = ZEXT3264(auVar282);
            auVar287._8_4_ = 0x7f800000;
            auVar287._0_8_ = 0x7f8000007f800000;
            auVar287._12_4_ = 0x7f800000;
            auVar287._16_4_ = 0x7f800000;
            auVar287._20_4_ = 0x7f800000;
            auVar287._24_4_ = 0x7f800000;
            auVar287._28_4_ = 0x7f800000;
            auVar280 = vblendvps_avx(auVar287,auVar282,auVar11);
            auVar102 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar102);
            auVar271 = ZEXT3264(auVar13);
            auVar240 = vblendvps_avx(auVar240,auVar280,auVar13);
            auVar280 = vblendvps_avx(auVar282,auVar287,auVar11);
            auVar277 = ZEXT3264(auVar280);
            auVar250 = vblendvps_avx(auVar250,auVar280,auVar13);
            auVar229._0_8_ = auVar145._0_8_ ^ 0xffffffffffffffff;
            auVar229._8_4_ = auVar145._8_4_ ^ 0xffffffff;
            auVar229._12_4_ = auVar145._12_4_ ^ 0xffffffff;
            auVar229._16_4_ = auVar145._16_4_ ^ 0xffffffff;
            auVar229._20_4_ = auVar145._20_4_ ^ 0xffffffff;
            auVar229._24_4_ = auVar145._24_4_ ^ 0xffffffff;
            auVar229._28_4_ = auVar145._28_4_ ^ 0xffffffff;
            auVar145 = vorps_avx(auVar11,auVar229);
            auVar145 = vandps_avx(auVar252,auVar145);
          }
        }
        auVar260 = ZEXT3264(_local_9e0);
        local_3e0 = _local_9e0;
        local_3c0 = vminps_avx(local_380,auVar240);
        local_a80 = vmaxps_avx(_local_9e0,auVar250);
        local_3a0 = local_a80;
        auVar280 = vcmpps_avx(_local_9e0,local_3c0,2);
        local_6a0 = vandps_avx(auVar280,auVar112);
        auVar280 = vcmpps_avx(local_a80,local_380,2);
        auVar112 = vandps_avx(auVar280,auVar112);
        auVar241 = ZEXT3264(auVar112);
        auVar280 = vorps_avx(auVar112,local_6a0);
        if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar280 >> 0x7f,0) != '\0') ||
              (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar280 >> 0xbf,0) != '\0') ||
            (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar280[0x1f] < '\0') {
          local_600._0_8_ = auVar145._0_8_ ^ 0xffffffffffffffff;
          local_600._8_4_ = auVar145._8_4_ ^ 0xffffffff;
          local_600._12_4_ = auVar145._12_4_ ^ 0xffffffff;
          local_600._16_4_ = auVar145._16_4_ ^ 0xffffffff;
          local_600._20_4_ = auVar145._20_4_ ^ 0xffffffff;
          local_600._24_4_ = auVar145._24_4_ ^ 0xffffffff;
          local_600._28_4_ = auVar145._28_4_ ^ 0xffffffff;
          auVar170._0_4_ = (float)local_9a0._0_4_ * auVar169._0_4_;
          auVar170._4_4_ = (float)local_9a0._4_4_ * auVar169._4_4_;
          auVar170._8_4_ = fStack_998 * auVar169._8_4_;
          auVar170._12_4_ = fStack_994 * auVar169._12_4_;
          auVar170._16_4_ = fStack_990 * auVar169._16_4_;
          auVar170._20_4_ = fStack_98c * auVar169._20_4_;
          auVar170._28_36_ = auVar169._28_36_;
          auVar170._24_4_ = fStack_988 * auVar169._24_4_;
          auVar102 = vfmadd213ps_fma(auVar142,_local_800,auVar170._0_32_);
          auVar102 = vfmadd213ps_fma(auVar117,_local_820,ZEXT1632(auVar102));
          auVar60._4_4_ = uStack_85c;
          auVar60._0_4_ = local_860;
          auVar60._8_4_ = uStack_858;
          auVar60._12_4_ = uStack_854;
          auVar60._16_4_ = uStack_850;
          auVar60._20_4_ = uStack_84c;
          auVar60._24_4_ = uStack_848;
          auVar60._28_4_ = uStack_844;
          auVar145 = vandps_avx(ZEXT1632(auVar102),auVar60);
          auVar143._8_4_ = 0x3e99999a;
          auVar143._0_8_ = 0x3e99999a3e99999a;
          auVar143._12_4_ = 0x3e99999a;
          auVar143._16_4_ = 0x3e99999a;
          auVar143._20_4_ = 0x3e99999a;
          auVar143._24_4_ = 0x3e99999a;
          auVar143._28_4_ = 0x3e99999a;
          auVar145 = vcmpps_avx(auVar145,auVar143,1);
          auVar145 = vorps_avx(auVar145,local_600);
          auVar144._8_4_ = 3;
          auVar144._0_8_ = 0x300000003;
          auVar144._12_4_ = 3;
          auVar144._16_4_ = 3;
          auVar144._20_4_ = 3;
          auVar144._24_4_ = 3;
          auVar144._28_4_ = 3;
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar145 = vblendvps_avx(auVar164,auVar144,auVar145);
          local_620._4_4_ = local_c08;
          local_620._0_4_ = local_c08;
          local_620._8_4_ = local_c08;
          local_620._12_4_ = local_c08;
          local_620._16_4_ = local_c08;
          local_620._20_4_ = local_c08;
          local_620._24_4_ = local_c08;
          local_620._28_4_ = local_c08;
          local_5e0 = vpcmpgtd_avx2(auVar145,local_620);
          local_5c0 = vpandn_avx2(local_5e0,local_6a0);
          auVar169 = ZEXT3264(local_5c0);
          auVar145 = local_6a0 & ~local_5e0;
          fStack_b6c = auVar9._4_4_;
          fStack_b68 = auVar9._8_4_;
          fStack_b64 = auVar9._12_4_;
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0x7f,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar145 >> 0xbf,0) == '\0') &&
              (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar145[0x1f]) {
            auVar118._4_4_ = fVar263;
            auVar118._0_4_ = fVar263;
            auVar118._8_4_ = fVar263;
            auVar118._12_4_ = fVar263;
            auVar118._16_4_ = fVar263;
            auVar118._20_4_ = fVar263;
            auVar118._24_4_ = fVar263;
            auVar118._28_4_ = fVar263;
            auVar112 = local_a80;
            fVar197 = (float)local_9a0._0_4_;
            fVar214 = (float)local_9a0._4_4_;
            fVar213 = fStack_998;
            fVar212 = fStack_994;
            fVar256 = fStack_990;
            fVar216 = fStack_98c;
            fVar215 = fStack_988;
            local_a80 = auVar14;
            local_7e0._16_16_ = auVar233;
          }
          else {
            auVar151 = vminps_avx(auVar10,auVar97);
            auVar102 = vmaxps_avx(auVar10,auVar97);
            auVar132 = vminps_avx(auVar8,auVar9);
            auVar96 = vminps_avx(auVar151,auVar132);
            auVar151 = vmaxps_avx(auVar8,auVar9);
            auVar132 = vmaxps_avx(auVar102,auVar151);
            auVar102 = vandps_avx(auVar96,auVar234);
            auVar151 = vandps_avx(auVar132,auVar234);
            auVar102 = vmaxps_avx(auVar102,auVar151);
            auVar151 = vmovshdup_avx(auVar102);
            auVar151 = vmaxss_avx(auVar151,auVar102);
            auVar102 = vshufpd_avx(auVar102,auVar102,1);
            auVar102 = vmaxss_avx(auVar102,auVar151);
            local_980 = ZEXT1632(CONCAT124(auVar105._4_12_,auVar102._0_4_ * 1.9073486e-06));
            local_9c0._0_16_ = vshufps_avx(auVar132,auVar132,0xff);
            local_9c0._16_16_ = auVar15._16_16_;
            local_840._4_4_ = (float)local_9e0._4_4_ + (float)local_920._4_4_;
            local_840._0_4_ = (float)local_9e0._0_4_ + (float)local_920._0_4_;
            fStack_838 = fStack_9d8 + fStack_918;
            fStack_834 = fStack_9d4 + fStack_914;
            fStack_830 = fStack_9d0 + fStack_910;
            fStack_82c = fStack_9cc + fStack_90c;
            fStack_828 = fStack_9c8 + fStack_908;
            fStack_824 = fStack_9c4 + fStack_904;
            local_640 = auVar112;
            do {
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar112 = auVar169._0_32_;
              auVar145 = vblendvps_avx(auVar119,_local_9e0,auVar112);
              auVar280 = vshufps_avx(auVar145,auVar145,0xb1);
              auVar280 = vminps_avx(auVar145,auVar280);
              auVar11 = vshufpd_avx(auVar280,auVar280,5);
              auVar280 = vminps_avx(auVar280,auVar11);
              auVar11 = vpermpd_avx2(auVar280,0x4e);
              auVar280 = vminps_avx(auVar280,auVar11);
              auVar145 = vcmpps_avx(auVar145,auVar280,0);
              auVar280 = auVar112 & auVar145;
              if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar280 >> 0x7f,0) != '\0') ||
                    (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar280 >> 0xbf,0) != '\0') ||
                  (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar280[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar145,auVar112);
              }
              uVar85 = vmovmskps_avx(auVar112);
              iVar16 = 0;
              for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar86 = iVar16 << 2;
              *(undefined4 *)(local_5c0 + uVar86) = 0;
              uVar85 = *(uint *)(local_1a0 + uVar86);
              uVar86 = *(uint *)(local_3e0 + uVar86);
              fVar197 = auVar6._0_4_;
              if ((float)local_a00._0_4_ < 0.0) {
                fVar197 = sqrtf((float)local_a00._0_4_);
              }
              local_a40._0_4_ = fVar197 * 1.9073486e-06;
              auVar102 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar85),0x10);
              auVar260 = ZEXT1664(auVar102);
              lVar90 = 5;
              do {
                auVar96 = auVar260._0_16_;
                local_ae0._0_16_ = vmovshdup_avx(auVar96);
                fVar211 = local_ae0._0_4_;
                fVar212 = 1.0 - fVar211;
                fVar217 = fVar212 * fVar212 * fVar212;
                fVar213 = fVar211 * fVar211;
                fVar214 = fVar211 * fVar213;
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                           ZEXT416((uint)fVar214));
                fVar197 = fVar211 * fVar212;
                auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar197 * 6.0)),
                                           ZEXT416((uint)(fVar212 * fVar197)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar132 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar197 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar211 * fVar197)));
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar214),
                                           ZEXT416((uint)fVar217));
                fVar211 = (auVar102._0_4_ + auVar132._0_4_) * 0.16666667;
                fVar214 = fVar214 * 0.16666667;
                auVar134._0_4_ = fVar214 * fVar124;
                auVar134._4_4_ = fVar214 * fStack_b6c;
                auVar134._8_4_ = fVar214 * fStack_b68;
                auVar134._12_4_ = fVar214 * fStack_b64;
                auVar175._4_4_ = fVar211;
                auVar175._0_4_ = fVar211;
                auVar175._8_4_ = fVar211;
                auVar175._12_4_ = fVar211;
                auVar102 = vfmadd132ps_fma(auVar175,auVar134,auVar8);
                fVar211 = (auVar105._0_4_ + auVar151._0_4_) * 0.16666667;
                auVar135._4_4_ = fVar211;
                auVar135._0_4_ = fVar211;
                auVar135._8_4_ = fVar211;
                auVar135._12_4_ = fVar211;
                auVar102 = vfmadd132ps_fma(auVar135,auVar102,auVar97);
                fVar214 = auVar260._0_4_;
                auVar152._4_4_ = fVar214;
                auVar152._0_4_ = fVar214;
                auVar152._8_4_ = fVar214;
                auVar152._12_4_ = fVar214;
                auVar105 = vfmadd213ps_fma(auVar152,local_9f0,_DAT_01f7aa10);
                fVar217 = fVar217 * 0.16666667;
                auVar98._4_4_ = fVar217;
                auVar98._0_4_ = fVar217;
                auVar98._8_4_ = fVar217;
                auVar98._12_4_ = fVar217;
                auVar102 = vfmadd132ps_fma(auVar98,auVar102,auVar10);
                local_780._0_16_ = auVar102;
                auVar102 = vsubps_avx(auVar105,auVar102);
                _local_ac0 = auVar102;
                auVar102 = vdpps_avx(auVar102,auVar102,0x7f);
                fVar211 = auVar102._0_4_;
                if (fVar211 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar212);
                  local_a20._0_4_ = fVar213;
                  auVar241._0_4_ = sqrtf(fVar211);
                  auVar241._4_60_ = extraout_var;
                  auVar105 = auVar241._0_16_;
                  fVar213 = (float)local_a20._0_4_;
                  auVar151 = local_b00._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar102,auVar102);
                  auVar151 = ZEXT416((uint)fVar212);
                }
                fVar217 = auVar151._0_4_;
                auVar99._4_4_ = fVar217;
                auVar99._0_4_ = fVar217;
                auVar99._8_4_ = fVar217;
                auVar99._12_4_ = fVar217;
                auVar133 = vfnmsub213ss_fma(local_ae0._0_16_,local_ae0._0_16_,
                                            ZEXT416((uint)(fVar197 * 4.0)));
                auVar132 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * 4.0)),auVar151,auVar151);
                fVar197 = fVar217 * -fVar217 * 0.5;
                fVar217 = auVar133._0_4_ * 0.5;
                fVar212 = auVar132._0_4_ * 0.5;
                fVar213 = fVar213 * 0.5;
                auVar224._0_4_ = fVar124 * fVar213;
                auVar224._4_4_ = fStack_b6c * fVar213;
                auVar224._8_4_ = fStack_b68 * fVar213;
                auVar224._12_4_ = fStack_b64 * fVar213;
                auVar176._4_4_ = fVar212;
                auVar176._0_4_ = fVar212;
                auVar176._8_4_ = fVar212;
                auVar176._12_4_ = fVar212;
                auVar132 = vfmadd213ps_fma(auVar176,auVar8,auVar224);
                auVar199._4_4_ = fVar217;
                auVar199._0_4_ = fVar217;
                auVar199._8_4_ = fVar217;
                auVar199._12_4_ = fVar217;
                auVar132 = vfmadd213ps_fma(auVar199,auVar97,auVar132);
                auVar269._4_4_ = fVar197;
                auVar269._0_4_ = fVar197;
                auVar269._8_4_ = fVar197;
                auVar269._12_4_ = fVar197;
                auVar174 = vfmadd213ps_fma(auVar269,auVar10,auVar132);
                auVar132 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar151,local_ae0._0_16_)
                ;
                auVar133 = vfmadd213ss_fma(local_ae0._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar151)
                ;
                auVar151 = vshufps_avx(auVar96,auVar96,0x55);
                auVar177._0_4_ = fVar124 * auVar151._0_4_;
                auVar177._4_4_ = fStack_b6c * auVar151._4_4_;
                auVar177._8_4_ = fStack_b68 * auVar151._8_4_;
                auVar177._12_4_ = fStack_b64 * auVar151._12_4_;
                uVar93 = auVar133._0_4_;
                auVar200._4_4_ = uVar93;
                auVar200._0_4_ = uVar93;
                auVar200._8_4_ = uVar93;
                auVar200._12_4_ = uVar93;
                auVar151 = vfmadd213ps_fma(auVar200,auVar8,auVar177);
                auVar153._0_4_ = auVar132._0_4_;
                auVar153._4_4_ = auVar153._0_4_;
                auVar153._8_4_ = auVar153._0_4_;
                auVar153._12_4_ = auVar153._0_4_;
                auVar151 = vfmadd213ps_fma(auVar153,auVar97,auVar151);
                auVar159 = vfmadd231ps_fma(auVar151,auVar10,auVar99);
                auVar132 = vdpps_avx(auVar174,auVar174,0x7f);
                auVar151 = vblendps_avx(auVar132,_DAT_01f7aa10,0xe);
                auVar133 = vrsqrtss_avx(auVar151,auVar151);
                fVar197 = auVar133._0_4_;
                fVar213 = auVar132._0_4_;
                fVar197 = fVar197 * 1.5 + fVar213 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar133 = vdpps_avx(auVar174,auVar159,0x7f);
                auVar154._0_4_ = auVar159._0_4_ * fVar213;
                auVar154._4_4_ = auVar159._4_4_ * fVar213;
                auVar154._8_4_ = auVar159._8_4_ * fVar213;
                auVar154._12_4_ = auVar159._12_4_ * fVar213;
                fVar217 = auVar133._0_4_;
                auVar225._0_4_ = auVar174._0_4_ * fVar217;
                auVar225._4_4_ = auVar174._4_4_ * fVar217;
                fVar212 = auVar174._8_4_;
                auVar225._8_4_ = fVar212 * fVar217;
                fVar256 = auVar174._12_4_;
                auVar225._12_4_ = fVar256 * fVar217;
                auVar133 = vsubps_avx(auVar154,auVar225);
                auVar151 = vrcpss_avx(auVar151,auVar151);
                auVar159 = vfnmadd213ss_fma(auVar151,auVar132,ZEXT416(0x40000000));
                fVar217 = auVar151._0_4_ * auVar159._0_4_;
                auVar151 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(fVar214 * (float)local_a40._0_4_)));
                auVar283 = ZEXT1664(auVar151);
                auVar244._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
                auVar244._8_4_ = -fVar212;
                auVar244._12_4_ = -fVar256;
                auVar178._0_4_ = fVar197 * auVar133._0_4_ * fVar217;
                auVar178._4_4_ = fVar197 * auVar133._4_4_ * fVar217;
                auVar178._8_4_ = fVar197 * auVar133._8_4_ * fVar217;
                auVar178._12_4_ = fVar197 * auVar133._12_4_ * fVar217;
                auVar236._0_4_ = auVar174._0_4_ * fVar197;
                auVar236._4_4_ = auVar174._4_4_ * fVar197;
                auVar236._8_4_ = fVar212 * fVar197;
                auVar236._12_4_ = fVar256 * fVar197;
                local_ae0._0_16_ = auVar174;
                local_b00._0_4_ = auVar151._0_4_;
                if (fVar213 < -fVar213) {
                  local_a20._0_4_ = auVar105._0_4_;
                  local_a60._0_16_ = auVar236;
                  local_940._0_16_ = auVar178;
                  fVar197 = sqrtf(fVar213);
                  auVar283 = ZEXT464((uint)local_b00._0_4_);
                  auVar105 = ZEXT416((uint)local_a20._0_4_);
                  auVar178 = local_940._0_16_;
                  auVar236 = local_a60._0_16_;
                }
                else {
                  auVar151 = vsqrtss_avx(auVar132,auVar132);
                  fVar197 = auVar151._0_4_;
                }
                auVar151 = vdpps_avx(_local_ac0,auVar236,0x7f);
                auVar174 = vfmadd213ss_fma(ZEXT416((uint)local_980._0_4_),auVar105,auVar283._0_16_);
                auVar132 = vdpps_avx(auVar244,auVar236,0x7f);
                auVar133 = vdpps_avx(_local_ac0,auVar178,0x7f);
                local_a20._0_16_ = vdpps_avx(local_9f0,auVar236,0x7f);
                auVar174 = vfmadd213ss_fma(ZEXT416((uint)(auVar105._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_980._0_4_ / fVar197)),
                                           auVar174);
                auVar277 = ZEXT1664(auVar174);
                fVar197 = auVar132._0_4_ + auVar133._0_4_;
                auVar100._0_4_ = auVar151._0_4_ * auVar151._0_4_;
                auVar100._4_4_ = auVar151._4_4_ * auVar151._4_4_;
                auVar100._8_4_ = auVar151._8_4_ * auVar151._8_4_;
                auVar100._12_4_ = auVar151._12_4_ * auVar151._12_4_;
                auVar105 = vdpps_avx(_local_ac0,auVar244,0x7f);
                auVar133 = vsubps_avx(auVar102,auVar100);
                auVar132 = vrsqrtss_avx(auVar133,auVar133);
                fVar217 = auVar133._0_4_;
                fVar214 = auVar132._0_4_;
                fVar214 = fVar214 * 1.5 + fVar217 * -0.5 * fVar214 * fVar214 * fVar214;
                auVar132 = vdpps_avx(_local_ac0,local_9f0,0x7f);
                auVar105 = vfnmadd231ss_fma(auVar105,auVar151,ZEXT416((uint)fVar197));
                auVar132 = vfnmadd231ss_fma(auVar132,auVar151,local_a20._0_16_);
                if (fVar217 < 0.0) {
                  local_a60._0_16_ = auVar151;
                  local_940._0_4_ = auVar174._0_4_;
                  local_7a0._0_16_ = ZEXT416((uint)fVar197);
                  local_7c0._0_4_ = fVar214;
                  local_7e0._0_16_ = auVar132;
                  fVar217 = sqrtf(fVar217);
                  auVar277 = ZEXT464((uint)local_940._0_4_);
                  auVar283 = ZEXT464((uint)local_b00._0_4_);
                  fVar214 = (float)local_7c0._0_4_;
                  auVar132 = local_7e0._0_16_;
                  auVar151 = local_a60._0_16_;
                  auVar133 = local_7a0._0_16_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar133,auVar133);
                  fVar217 = auVar133._0_4_;
                  auVar133 = ZEXT416((uint)fVar197);
                }
                auVar271 = ZEXT1664(local_ae0._0_16_);
                auVar174 = vpermilps_avx(local_780._0_16_,0xff);
                fVar217 = fVar217 - auVar174._0_4_;
                auVar174 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xff);
                auVar105 = vfmsub213ss_fma(auVar105,ZEXT416((uint)fVar214),auVar174);
                auVar179._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
                auVar179._8_4_ = local_a20._8_4_ ^ 0x80000000;
                auVar179._12_4_ = local_a20._12_4_ ^ 0x80000000;
                auVar201._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar159 = ZEXT416((uint)(auVar132._0_4_ * fVar214));
                auVar132 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * local_a20._0_4_)),
                                           auVar133,auVar159);
                auVar105 = vinsertps_avx(auVar201,auVar159,0x1c);
                uVar93 = auVar132._0_4_;
                auVar202._4_4_ = uVar93;
                auVar202._0_4_ = uVar93;
                auVar202._8_4_ = uVar93;
                auVar202._12_4_ = uVar93;
                auVar105 = vdivps_avx(auVar105,auVar202);
                auVar132 = vinsertps_avx(auVar133,auVar179,0x10);
                auVar132 = vdivps_avx(auVar132,auVar202);
                fVar197 = auVar151._0_4_;
                auVar155._0_4_ = fVar197 * auVar105._0_4_ + fVar217 * auVar132._0_4_;
                auVar155._4_4_ = fVar197 * auVar105._4_4_ + fVar217 * auVar132._4_4_;
                auVar155._8_4_ = fVar197 * auVar105._8_4_ + fVar217 * auVar132._8_4_;
                auVar155._12_4_ = fVar197 * auVar105._12_4_ + fVar217 * auVar132._12_4_;
                auVar132 = vsubps_avx(auVar96,auVar155);
                auVar260 = ZEXT1664(auVar132);
                auVar105 = vandps_avx(auVar151,auVar234);
                fVar197 = (float)local_9a0._0_4_;
                fVar214 = (float)local_9a0._4_4_;
                fVar213 = fStack_998;
                fVar212 = fStack_994;
                fVar256 = fStack_990;
                fVar216 = fStack_98c;
                fVar215 = fStack_988;
                if (auVar105._0_4_ < auVar277._0_4_) {
                  auVar151 = vfmadd231ss_fma(ZEXT416((uint)(auVar283._0_4_ + auVar277._0_4_)),
                                             local_9c0._0_16_,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(ZEXT416((uint)fVar217),auVar234);
                  if (auVar105._0_4_ < auVar151._0_4_) {
                    fVar217 = auVar132._0_4_ + (float)local_8d0._0_4_;
                    auVar105 = ZEXT416((uint)fVar217);
                    if (fVar92 <= fVar217) {
                      fVar273 = *(float *)(ray + k * 4 + 0x80);
                      auVar277 = ZEXT464((uint)fVar273);
                      if (fVar217 <= fVar273) {
                        auVar151 = vmovshdup_avx(auVar132);
                        fVar219 = auVar151._0_4_;
                        if ((0.0 <= fVar219) && (fVar219 <= 1.0)) {
                          auVar102 = vrsqrtss_avx(auVar102,auVar102);
                          fVar218 = auVar102._0_4_;
                          pGVar4 = (context->scene->geometries).items[uVar84].ptr;
                          if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                            fVar211 = fVar218 * 1.5 + fVar211 * -0.5 * fVar218 * fVar218 * fVar218;
                            auVar180._0_4_ = fVar211 * (float)local_ac0._0_4_;
                            auVar180._4_4_ = fVar211 * (float)local_ac0._4_4_;
                            auVar180._8_4_ = fVar211 * fStack_ab8;
                            auVar180._12_4_ = fVar211 * fStack_ab4;
                            auVar133 = vfmadd213ps_fma(auVar174,auVar180,local_ae0._0_16_);
                            auVar102 = vshufps_avx(auVar180,auVar180,0xc9);
                            auVar151 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xc9);
                            auVar181._0_4_ = auVar180._0_4_ * auVar151._0_4_;
                            auVar181._4_4_ = auVar180._4_4_ * auVar151._4_4_;
                            auVar181._8_4_ = auVar180._8_4_ * auVar151._8_4_;
                            auVar181._12_4_ = auVar180._12_4_ * auVar151._12_4_;
                            auVar96 = vfmsub231ps_fma(auVar181,local_ae0._0_16_,auVar102);
                            auVar102 = vshufps_avx(auVar96,auVar96,0xc9);
                            auVar151 = vshufps_avx(auVar133,auVar133,0xc9);
                            auVar96 = vshufps_avx(auVar96,auVar96,0xd2);
                            auVar101._0_4_ = auVar133._0_4_ * auVar96._0_4_;
                            auVar101._4_4_ = auVar133._4_4_ * auVar96._4_4_;
                            auVar101._8_4_ = auVar133._8_4_ * auVar96._8_4_;
                            auVar101._12_4_ = auVar133._12_4_ * auVar96._12_4_;
                            auVar102 = vfmsub231ps_fma(auVar101,auVar102,auVar151);
                            uVar93 = auVar102._0_4_;
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x80) = fVar217;
                              uVar3 = vextractps_avx(auVar102,1);
                              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                              uVar3 = vextractps_avx(auVar102,2);
                              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar93;
                              *(float *)(ray + k * 4 + 0xf0) = fVar219;
                              *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                              *(undefined4 *)(ray + k * 4 + 0x110) = local_960;
                              *(uint *)(ray + k * 4 + 0x120) = uVar84;
                              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            }
                            else {
                              local_710 = vshufps_avx(auVar132,auVar132,0x55);
                              auVar151 = vshufps_avx(auVar102,auVar102,0x55);
                              auStack_730 = vshufps_avx(auVar102,auVar102,0xaa);
                              local_740 = (RTCHitN  [16])auVar151;
                              local_720 = uVar93;
                              uStack_71c = uVar93;
                              uStack_718 = uVar93;
                              uStack_714 = uVar93;
                              local_700 = ZEXT416(0) << 0x20;
                              local_6f0 = CONCAT44(uStack_75c,local_760);
                              uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                              local_6e0._4_4_ = uStack_74c;
                              local_6e0._0_4_ = local_750;
                              local_6e0._8_4_ = uStack_748;
                              local_6e0._12_4_ = uStack_744;
                              vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                              uStack_6cc = context->user->instID[0];
                              local_6d0 = uStack_6cc;
                              uStack_6c8 = uStack_6cc;
                              uStack_6c4 = uStack_6cc;
                              uStack_6c0 = context->user->instPrimID[0];
                              uStack_6bc = uStack_6c0;
                              uStack_6b8 = uStack_6c0;
                              uStack_6b4 = uStack_6c0;
                              *(float *)(ray + k * 4 + 0x80) = fVar217;
                              local_900._0_16_ = *local_a88;
                              local_b30.valid = (int *)local_900;
                              local_b30.geometryUserPtr = pGVar4->userPtr;
                              local_b30.context = context->user;
                              local_b30.hit = local_740;
                              local_b30.N = 4;
                              auVar102 = *local_a88;
                              local_b30.ray = (RTCRayN *)ray;
                              if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar260 = ZEXT1664(auVar132);
                                auVar271 = ZEXT1664(local_ae0._0_16_);
                                auVar283 = ZEXT1664(auVar283._0_16_);
                                (*pGVar4->intersectionFilterN)(&local_b30);
                                auVar277._8_56_ = extraout_var_01;
                                auVar277._0_8_ = extraout_XMM1_Qa;
                                auVar105 = auVar277._0_16_;
                                auVar102 = local_900._0_16_;
                                fVar197 = (float)local_9a0._0_4_;
                                fVar214 = (float)local_9a0._4_4_;
                                fVar213 = fStack_998;
                                fVar212 = fStack_994;
                                fVar256 = fStack_990;
                                fVar216 = fStack_98c;
                                fVar215 = fStack_988;
                              }
                              if (auVar102 == (undefined1  [16])0x0) {
                                auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar102 = vpcmpeqd_avx(auVar105,auVar105);
                                auVar151 = auVar151 ^ auVar102;
                              }
                              else {
                                p_Var5 = context->args->filter;
                                auVar105 = vpcmpeqd_avx(auVar151,auVar151);
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar260 = ZEXT1664(auVar260._0_16_);
                                  auVar271 = ZEXT1664(auVar271._0_16_);
                                  auVar283 = ZEXT1664(auVar283._0_16_);
                                  (*p_Var5)(&local_b30);
                                  auVar105 = vpcmpeqd_avx(auVar105,auVar105);
                                  auVar102 = local_900._0_16_;
                                  fVar197 = (float)local_9a0._0_4_;
                                  fVar214 = (float)local_9a0._4_4_;
                                  fVar213 = fStack_998;
                                  fVar212 = fStack_994;
                                  fVar256 = fStack_990;
                                  fVar216 = fStack_98c;
                                  fVar215 = fStack_988;
                                }
                                auVar132 = vpcmpeqd_avx(auVar102,_DAT_01f7aa10);
                                auVar151 = auVar132 ^ auVar105;
                                if (auVar102 != (undefined1  [16])0x0) {
                                  auVar132 = auVar132 ^ auVar105;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      local_b30.hit);
                                  *(undefined1 (*) [16])(local_b30.ray + 0xc0) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x10));
                                  *(undefined1 (*) [16])(local_b30.ray + 0xd0) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x20));
                                  *(undefined1 (*) [16])(local_b30.ray + 0xe0) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x30));
                                  *(undefined1 (*) [16])(local_b30.ray + 0xf0) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x40));
                                  *(undefined1 (*) [16])(local_b30.ray + 0x100) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x50));
                                  *(undefined1 (*) [16])(local_b30.ray + 0x110) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x60));
                                  *(undefined1 (*) [16])(local_b30.ray + 0x120) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x70));
                                  *(undefined1 (*) [16])(local_b30.ray + 0x130) = auVar102;
                                  auVar102 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                      (local_b30.hit + 0x80));
                                  *(undefined1 (*) [16])(local_b30.ray + 0x140) = auVar102;
                                }
                              }
                              auVar277 = ZEXT464((uint)fVar273);
                              auVar103._8_8_ = 0x100000001;
                              auVar103._0_8_ = 0x100000001;
                              if ((auVar103 & auVar151) == (undefined1  [16])0x0) {
                                *(float *)(ray + k * 4 + 0x80) = fVar273;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar90 = lVar90 + -1;
              } while (lVar90 != 0);
              auVar145 = local_5c0;
              uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar118._4_4_ = uVar93;
              auVar118._0_4_ = uVar93;
              auVar118._8_4_ = uVar93;
              auVar118._12_4_ = uVar93;
              auVar118._16_4_ = uVar93;
              auVar118._20_4_ = uVar93;
              auVar118._24_4_ = uVar93;
              auVar118._28_4_ = uVar93;
              auVar112 = vcmpps_avx(_local_840,auVar118,2);
              local_5c0 = vandps_avx(auVar112,local_5c0);
              auVar169 = ZEXT3264(local_5c0);
              auVar145 = auVar145 & auVar112;
            } while ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar145 >> 0x7f,0) != '\0') ||
                       (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar145 >> 0xbf,0) != '\0') ||
                     (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar145[0x1f] < '\0');
            auVar169 = ZEXT3264(local_3a0);
            auVar241 = ZEXT3264(local_640);
            auVar112 = local_a80;
          }
          auVar149._0_4_ = fVar197 * (float)local_680._0_4_;
          auVar149._4_4_ = fVar214 * (float)local_680._4_4_;
          auVar149._8_4_ = fVar213 * fStack_678;
          auVar149._12_4_ = fVar212 * fStack_674;
          auVar149._16_4_ = fVar256 * fStack_670;
          auVar149._20_4_ = fVar216 * fStack_66c;
          auVar149._28_36_ = auVar169._28_36_;
          auVar149._24_4_ = fVar215 * fStack_668;
          auVar102 = vfmadd213ps_fma(local_8a0,_local_800,auVar149._0_32_);
          auVar102 = vfmadd213ps_fma(local_880,_local_820,ZEXT1632(auVar102));
          auVar61._4_4_ = uStack_85c;
          auVar61._0_4_ = local_860;
          auVar61._8_4_ = uStack_858;
          auVar61._12_4_ = uStack_854;
          auVar61._16_4_ = uStack_850;
          auVar61._20_4_ = uStack_84c;
          auVar61._24_4_ = uStack_848;
          auVar61._28_4_ = uStack_844;
          auVar145 = vandps_avx(ZEXT1632(auVar102),auVar61);
          auVar165._8_4_ = 0x3e99999a;
          auVar165._0_8_ = 0x3e99999a3e99999a;
          auVar165._12_4_ = 0x3e99999a;
          auVar165._16_4_ = 0x3e99999a;
          auVar165._20_4_ = 0x3e99999a;
          auVar165._24_4_ = 0x3e99999a;
          auVar165._28_4_ = 0x3e99999a;
          auVar145 = vcmpps_avx(auVar145,auVar165,1);
          auVar145 = vorps_avx(auVar145,local_600);
          auVar166._0_4_ = auVar112._0_4_ + (float)local_920._0_4_;
          auVar166._4_4_ = auVar112._4_4_ + (float)local_920._4_4_;
          auVar166._8_4_ = auVar112._8_4_ + fStack_918;
          auVar166._12_4_ = auVar112._12_4_ + fStack_914;
          auVar166._16_4_ = auVar112._16_4_ + fStack_910;
          auVar166._20_4_ = auVar112._20_4_ + fStack_90c;
          auVar166._24_4_ = auVar112._24_4_ + fStack_908;
          auVar166._28_4_ = auVar112._28_4_ + fStack_904;
          auVar112 = vcmpps_avx(auVar166,auVar118,2);
          local_880 = vandps_avx(auVar112,auVar241._0_32_);
          auVar167._8_4_ = 3;
          auVar167._0_8_ = 0x300000003;
          auVar167._12_4_ = 3;
          auVar167._16_4_ = 3;
          auVar167._20_4_ = 3;
          auVar167._24_4_ = 3;
          auVar167._28_4_ = 3;
          auVar195._8_4_ = 2;
          auVar195._0_8_ = 0x200000002;
          auVar195._12_4_ = 2;
          auVar195._16_4_ = 2;
          auVar195._20_4_ = 2;
          auVar195._24_4_ = 2;
          auVar195._28_4_ = 2;
          auVar112 = vblendvps_avx(auVar195,auVar167,auVar145);
          local_8a0 = vpcmpgtd_avx2(auVar112,local_620);
          auVar112 = vpandn_avx2(local_8a0,local_880);
          auVar145 = local_880 & ~local_8a0;
          local_900 = auVar112;
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar145 >> 0x7f,0) != '\0') ||
                (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0xbf,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar145[0x1f] < '\0') {
            auVar105 = vminps_avx(auVar10,auVar97);
            auVar102 = vmaxps_avx(auVar10,auVar97);
            auVar151 = vminps_avx(auVar8,auVar9);
            auVar132 = vminps_avx(auVar105,auVar151);
            auVar105 = vmaxps_avx(auVar8,auVar9);
            auVar151 = vmaxps_avx(auVar102,auVar105);
            auVar102 = vandps_avx(auVar132,auVar234);
            auVar105 = vandps_avx(auVar151,auVar234);
            auVar102 = vmaxps_avx(auVar102,auVar105);
            auVar105 = vmovshdup_avx(auVar102);
            auVar105 = vmaxss_avx(auVar105,auVar102);
            auVar102 = vshufpd_avx(auVar102,auVar102,1);
            auVar102 = vmaxss_avx(auVar102,auVar105);
            local_980._0_4_ = auVar102._0_4_ * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar151,auVar151,0xff);
            local_840._4_4_ = (float)local_920._4_4_ + local_3a0._4_4_;
            local_840._0_4_ = (float)local_920._0_4_ + local_3a0._0_4_;
            fStack_838 = fStack_918 + local_3a0._8_4_;
            fStack_834 = fStack_914 + local_3a0._12_4_;
            fStack_830 = fStack_910 + local_3a0._16_4_;
            fStack_82c = fStack_90c + local_3a0._20_4_;
            fStack_828 = fStack_908 + local_3a0._24_4_;
            fStack_824 = fStack_904 + local_3a0._28_4_;
            local_9c0 = local_3a0;
            do {
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar145 = vblendvps_avx(auVar120,local_9c0,auVar112);
              auVar280 = vshufps_avx(auVar145,auVar145,0xb1);
              auVar280 = vminps_avx(auVar145,auVar280);
              auVar11 = vshufpd_avx(auVar280,auVar280,5);
              auVar280 = vminps_avx(auVar280,auVar11);
              auVar11 = vpermpd_avx2(auVar280,0x4e);
              auVar280 = vminps_avx(auVar280,auVar11);
              auVar280 = vcmpps_avx(auVar145,auVar280,0);
              auVar11 = auVar112 & auVar280;
              auVar145 = auVar112;
              if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar11 >> 0x7f,0) != '\0') ||
                    (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0xbf,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar11[0x1f] < '\0') {
                auVar145 = vandps_avx(auVar280,auVar112);
              }
              uVar85 = vmovmskps_avx(auVar145);
              iVar16 = 0;
              for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar86 = iVar16 << 2;
              local_900 = auVar112;
              *(undefined4 *)(local_900 + uVar86) = 0;
              uVar85 = *(uint *)(local_1c0 + uVar86);
              uVar86 = *(uint *)(local_380 + uVar86);
              fVar197 = auVar7._0_4_;
              if ((float)local_a00._0_4_ < 0.0) {
                fVar197 = sqrtf((float)local_a00._0_4_);
              }
              local_a20._0_4_ = fVar197 * 1.9073486e-06;
              auVar102 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar85),0x10);
              auVar260 = ZEXT1664(auVar102);
              lVar90 = 5;
              do {
                auVar96 = auVar260._0_16_;
                local_ae0._0_16_ = vmovshdup_avx(auVar96);
                fVar212 = local_ae0._0_4_;
                fVar213 = 1.0 - fVar212;
                fVar217 = fVar213 * fVar213 * fVar213;
                fVar214 = fVar212 * fVar212 * fVar212;
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                           ZEXT416((uint)fVar214));
                fVar197 = fVar212 * fVar213;
                auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar197 * 6.0)),
                                           ZEXT416((uint)(fVar213 * fVar197)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar132 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar197 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar212 * fVar197)));
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar214),
                                           ZEXT416((uint)fVar217));
                fVar211 = (auVar102._0_4_ + auVar132._0_4_) * 0.16666667;
                fVar214 = fVar214 * 0.16666667;
                auVar136._0_4_ = fVar214 * fVar124;
                auVar136._4_4_ = fVar214 * fStack_b6c;
                auVar136._8_4_ = fVar214 * fStack_b68;
                auVar136._12_4_ = fVar214 * fStack_b64;
                auVar182._4_4_ = fVar211;
                auVar182._0_4_ = fVar211;
                auVar182._8_4_ = fVar211;
                auVar182._12_4_ = fVar211;
                auVar102 = vfmadd132ps_fma(auVar182,auVar136,auVar8);
                fVar211 = (auVar105._0_4_ + auVar151._0_4_) * 0.16666667;
                auVar137._4_4_ = fVar211;
                auVar137._0_4_ = fVar211;
                auVar137._8_4_ = fVar211;
                auVar137._12_4_ = fVar211;
                auVar102 = vfmadd132ps_fma(auVar137,auVar102,auVar97);
                fVar214 = auVar260._0_4_;
                auVar156._4_4_ = fVar214;
                auVar156._0_4_ = fVar214;
                auVar156._8_4_ = fVar214;
                auVar156._12_4_ = fVar214;
                auVar105 = vfmadd213ps_fma(auVar156,local_9f0,_DAT_01f7aa10);
                fVar217 = fVar217 * 0.16666667;
                auVar104._4_4_ = fVar217;
                auVar104._0_4_ = fVar217;
                auVar104._8_4_ = fVar217;
                auVar104._12_4_ = fVar217;
                auVar102 = vfmadd132ps_fma(auVar104,auVar102,auVar10);
                local_780._0_16_ = auVar102;
                auVar102 = vsubps_avx(auVar105,auVar102);
                _local_ac0 = auVar102;
                auVar102 = vdpps_avx(auVar102,auVar102,0x7f);
                fVar211 = auVar102._0_4_;
                if (fVar211 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar213);
                  local_a40._0_4_ = fVar197;
                  auVar260._0_4_ = sqrtf(fVar211);
                  auVar260._4_60_ = extraout_var_00;
                  auVar105 = auVar260._0_16_;
                  fVar197 = (float)local_a40._0_4_;
                  auVar151 = local_b00._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar102,auVar102);
                  auVar151 = ZEXT416((uint)fVar213);
                }
                fVar217 = auVar151._0_4_;
                auVar106._4_4_ = fVar217;
                auVar106._0_4_ = fVar217;
                auVar106._8_4_ = fVar217;
                auVar106._12_4_ = fVar217;
                auVar133 = vfnmsub213ss_fma(local_ae0._0_16_,local_ae0._0_16_,
                                            ZEXT416((uint)(fVar197 * 4.0)));
                auVar132 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * 4.0)),auVar151,auVar151);
                fVar197 = fVar217 * -fVar217 * 0.5;
                fVar217 = auVar133._0_4_ * 0.5;
                fVar213 = auVar132._0_4_ * 0.5;
                fVar212 = fVar212 * fVar212 * 0.5;
                auVar226._0_4_ = fVar124 * fVar212;
                auVar226._4_4_ = fStack_b6c * fVar212;
                auVar226._8_4_ = fStack_b68 * fVar212;
                auVar226._12_4_ = fStack_b64 * fVar212;
                auVar183._4_4_ = fVar213;
                auVar183._0_4_ = fVar213;
                auVar183._8_4_ = fVar213;
                auVar183._12_4_ = fVar213;
                auVar132 = vfmadd213ps_fma(auVar183,auVar8,auVar226);
                auVar203._4_4_ = fVar217;
                auVar203._0_4_ = fVar217;
                auVar203._8_4_ = fVar217;
                auVar203._12_4_ = fVar217;
                auVar132 = vfmadd213ps_fma(auVar203,auVar97,auVar132);
                auVar270._4_4_ = fVar197;
                auVar270._0_4_ = fVar197;
                auVar270._8_4_ = fVar197;
                auVar270._12_4_ = fVar197;
                auVar174 = vfmadd213ps_fma(auVar270,auVar10,auVar132);
                auVar132 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar151,local_ae0._0_16_)
                ;
                auVar133 = vfmadd213ss_fma(local_ae0._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar151)
                ;
                auVar151 = vshufps_avx(auVar96,auVar96,0x55);
                auVar184._0_4_ = fVar124 * auVar151._0_4_;
                auVar184._4_4_ = fStack_b6c * auVar151._4_4_;
                auVar184._8_4_ = fStack_b68 * auVar151._8_4_;
                auVar184._12_4_ = fStack_b64 * auVar151._12_4_;
                uVar93 = auVar133._0_4_;
                auVar204._4_4_ = uVar93;
                auVar204._0_4_ = uVar93;
                auVar204._8_4_ = uVar93;
                auVar204._12_4_ = uVar93;
                auVar151 = vfmadd213ps_fma(auVar204,auVar8,auVar184);
                auVar157._0_4_ = auVar132._0_4_;
                auVar157._4_4_ = auVar157._0_4_;
                auVar157._8_4_ = auVar157._0_4_;
                auVar157._12_4_ = auVar157._0_4_;
                auVar151 = vfmadd213ps_fma(auVar157,auVar97,auVar151);
                auVar159 = vfmadd231ps_fma(auVar151,auVar10,auVar106);
                auVar132 = vdpps_avx(auVar174,auVar174,0x7f);
                auVar151 = vblendps_avx(auVar132,_DAT_01f7aa10,0xe);
                auVar133 = vrsqrtss_avx(auVar151,auVar151);
                fVar197 = auVar133._0_4_;
                fVar213 = auVar132._0_4_;
                fVar197 = fVar197 * 1.5 + fVar213 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar133 = vdpps_avx(auVar174,auVar159,0x7f);
                auVar158._0_4_ = auVar159._0_4_ * fVar213;
                auVar158._4_4_ = auVar159._4_4_ * fVar213;
                auVar158._8_4_ = auVar159._8_4_ * fVar213;
                auVar158._12_4_ = auVar159._12_4_ * fVar213;
                fVar217 = auVar133._0_4_;
                auVar227._0_4_ = auVar174._0_4_ * fVar217;
                auVar227._4_4_ = auVar174._4_4_ * fVar217;
                fVar212 = auVar174._8_4_;
                auVar227._8_4_ = fVar212 * fVar217;
                fVar256 = auVar174._12_4_;
                auVar227._12_4_ = fVar256 * fVar217;
                auVar133 = vsubps_avx(auVar158,auVar227);
                auVar151 = vrcpss_avx(auVar151,auVar151);
                auVar159 = vfnmadd213ss_fma(auVar151,auVar132,ZEXT416(0x40000000));
                fVar217 = auVar151._0_4_ * auVar159._0_4_;
                auVar151 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(fVar214 * (float)local_a20._0_4_)));
                auVar169 = ZEXT1664(auVar151);
                auVar237._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = -fVar212;
                auVar237._12_4_ = -fVar256;
                auVar185._0_4_ = fVar197 * auVar133._0_4_ * fVar217;
                auVar185._4_4_ = fVar197 * auVar133._4_4_ * fVar217;
                auVar185._8_4_ = fVar197 * auVar133._8_4_ * fVar217;
                auVar185._12_4_ = fVar197 * auVar133._12_4_ * fVar217;
                auVar259._0_4_ = auVar174._0_4_ * fVar197;
                auVar259._4_4_ = auVar174._4_4_ * fVar197;
                auVar259._8_4_ = fVar212 * fVar197;
                auVar259._12_4_ = fVar256 * fVar197;
                local_ae0._0_16_ = auVar174;
                local_b00._0_4_ = auVar151._0_4_;
                if (fVar213 < -fVar213) {
                  local_a40._0_16_ = auVar237;
                  local_a80._0_16_ = auVar259;
                  local_a60._0_16_ = auVar185;
                  fVar197 = sqrtf(fVar213);
                  auVar169 = ZEXT464((uint)local_b00._0_4_);
                  auVar105 = ZEXT416(auVar105._0_4_);
                  auVar185 = local_a60._0_16_;
                  auVar237 = local_a40._0_16_;
                  auVar259 = local_a80._0_16_;
                }
                else {
                  auVar151 = vsqrtss_avx(auVar132,auVar132);
                  fVar197 = auVar151._0_4_;
                }
                auVar151 = vdpps_avx(_local_ac0,auVar259,0x7f);
                auVar159 = vfmadd213ss_fma(ZEXT416((uint)local_980._0_4_),auVar105,auVar169._0_16_);
                auVar132 = vdpps_avx(auVar237,auVar259,0x7f);
                auVar133 = vdpps_avx(_local_ac0,auVar185,0x7f);
                auVar174 = vdpps_avx(local_9f0,auVar259,0x7f);
                auVar159 = vfmadd213ss_fma(ZEXT416((uint)(auVar105._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_980._0_4_ / fVar197)),
                                           auVar159);
                auVar277 = ZEXT1664(auVar159);
                fVar197 = auVar132._0_4_ + auVar133._0_4_;
                auVar283 = ZEXT464((uint)fVar197);
                fVar217 = auVar151._0_4_;
                auVar107._0_4_ = fVar217 * fVar217;
                auVar107._4_4_ = auVar151._4_4_ * auVar151._4_4_;
                auVar107._8_4_ = auVar151._8_4_ * auVar151._8_4_;
                auVar107._12_4_ = auVar151._12_4_ * auVar151._12_4_;
                auVar105 = vdpps_avx(_local_ac0,auVar237,0x7f);
                auVar133 = vsubps_avx(auVar102,auVar107);
                auVar132 = vrsqrtss_avx(auVar133,auVar133);
                fVar213 = auVar133._0_4_;
                fVar214 = auVar132._0_4_;
                fVar214 = fVar214 * 1.5 + fVar213 * -0.5 * fVar214 * fVar214 * fVar214;
                auVar132 = vdpps_avx(_local_ac0,local_9f0,0x7f);
                auVar105 = vfnmadd231ss_fma(auVar105,auVar151,ZEXT416((uint)fVar197));
                auVar132 = vfnmadd231ss_fma(auVar132,auVar151,auVar174);
                if (fVar213 < 0.0) {
                  local_a40._0_4_ = auVar159._0_4_;
                  local_a80._0_16_ = ZEXT416((uint)fVar197);
                  local_a60._0_16_ = auVar174;
                  local_940._0_16_ = auVar105;
                  local_7a0._0_4_ = fVar214;
                  local_7c0._0_16_ = auVar132;
                  fVar197 = sqrtf(fVar213);
                  auVar283 = ZEXT1664(local_a80._0_16_);
                  auVar277 = ZEXT464((uint)local_a40._0_4_);
                  auVar169 = ZEXT464((uint)local_b00._0_4_);
                  fVar214 = (float)local_7a0._0_4_;
                  auVar132 = local_7c0._0_16_;
                  auVar174 = local_a60._0_16_;
                  auVar105 = local_940._0_16_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar133,auVar133);
                  fVar197 = auVar133._0_4_;
                }
                auVar271 = ZEXT1664(auVar151);
                auVar241 = ZEXT1664(local_ae0._0_16_);
                auVar133 = vpermilps_avx(local_780._0_16_,0xff);
                fVar197 = fVar197 - auVar133._0_4_;
                auVar133 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xff);
                auVar105 = vfmsub213ss_fma(auVar105,ZEXT416((uint)fVar214),auVar133);
                auVar186._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
                auVar186._8_4_ = auVar174._8_4_ ^ 0x80000000;
                auVar186._12_4_ = auVar174._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar159 = ZEXT416((uint)(auVar132._0_4_ * fVar214));
                auVar95 = auVar283._0_16_;
                auVar132 = vfmsub231ss_fma(ZEXT416((uint)(auVar174._0_4_ * auVar105._0_4_)),auVar95,
                                           auVar159);
                auVar105 = vinsertps_avx(auVar205,auVar159,0x1c);
                uVar93 = auVar132._0_4_;
                auVar206._4_4_ = uVar93;
                auVar206._0_4_ = uVar93;
                auVar206._8_4_ = uVar93;
                auVar206._12_4_ = uVar93;
                auVar105 = vdivps_avx(auVar105,auVar206);
                auVar132 = vinsertps_avx(auVar95,auVar186,0x10);
                auVar132 = vdivps_avx(auVar132,auVar206);
                auVar160._0_4_ = fVar217 * auVar105._0_4_ + fVar197 * auVar132._0_4_;
                auVar160._4_4_ = fVar217 * auVar105._4_4_ + fVar197 * auVar132._4_4_;
                auVar160._8_4_ = fVar217 * auVar105._8_4_ + fVar197 * auVar132._8_4_;
                auVar160._12_4_ = fVar217 * auVar105._12_4_ + fVar197 * auVar132._12_4_;
                auVar132 = vsubps_avx(auVar96,auVar160);
                auVar260 = ZEXT1664(auVar132);
                auVar105 = vandps_avx(auVar151,auVar234);
                if (auVar105._0_4_ < auVar277._0_4_) {
                  auVar96 = vfmadd231ss_fma(ZEXT416((uint)(auVar169._0_4_ + auVar277._0_4_)),
                                            local_7e0._0_16_,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(ZEXT416((uint)fVar197),auVar234);
                  if (auVar105._0_4_ < auVar96._0_4_) {
                    fVar197 = auVar132._0_4_ + (float)local_8d0._0_4_;
                    auVar105 = ZEXT416((uint)fVar197);
                    if ((fVar92 <= fVar197) &&
                       (fVar214 = *(float *)(ray + k * 4 + 0x80), fVar197 <= fVar214)) {
                      auVar96 = vmovshdup_avx(auVar132);
                      fVar217 = auVar96._0_4_;
                      if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
                        auVar102 = vrsqrtss_avx(auVar102,auVar102);
                        fVar213 = auVar102._0_4_;
                        pGVar4 = (context->scene->geometries).items[uVar84].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          fVar211 = fVar213 * 1.5 + fVar211 * -0.5 * fVar213 * fVar213 * fVar213;
                          auVar187._0_4_ = fVar211 * (float)local_ac0._0_4_;
                          auVar187._4_4_ = fVar211 * (float)local_ac0._4_4_;
                          auVar187._8_4_ = fVar211 * fStack_ab8;
                          auVar187._12_4_ = fVar211 * fStack_ab4;
                          auVar174 = vfmadd213ps_fma(auVar133,auVar187,local_ae0._0_16_);
                          auVar102 = vshufps_avx(auVar187,auVar187,0xc9);
                          auVar96 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xc9);
                          auVar188._0_4_ = auVar187._0_4_ * auVar96._0_4_;
                          auVar188._4_4_ = auVar187._4_4_ * auVar96._4_4_;
                          auVar188._8_4_ = auVar187._8_4_ * auVar96._8_4_;
                          auVar188._12_4_ = auVar187._12_4_ * auVar96._12_4_;
                          auVar133 = vfmsub231ps_fma(auVar188,local_ae0._0_16_,auVar102);
                          auVar102 = vshufps_avx(auVar133,auVar133,0xc9);
                          auVar96 = vshufps_avx(auVar174,auVar174,0xc9);
                          auVar133 = vshufps_avx(auVar133,auVar133,0xd2);
                          auVar108._0_4_ = auVar174._0_4_ * auVar133._0_4_;
                          auVar108._4_4_ = auVar174._4_4_ * auVar133._4_4_;
                          auVar108._8_4_ = auVar174._8_4_ * auVar133._8_4_;
                          auVar108._12_4_ = auVar174._12_4_ * auVar133._12_4_;
                          auVar102 = vfmsub231ps_fma(auVar108,auVar102,auVar96);
                          uVar93 = auVar102._0_4_;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar197;
                            uVar3 = vextractps_avx(auVar102,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                            uVar3 = vextractps_avx(auVar102,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar93;
                            *(float *)(ray + k * 4 + 0xf0) = fVar217;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(undefined4 *)(ray + k * 4 + 0x110) = local_960;
                            *(uint *)(ray + k * 4 + 0x120) = uVar84;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_710 = vshufps_avx(auVar132,auVar132,0x55);
                            auVar96 = vshufps_avx(auVar102,auVar102,0x55);
                            auStack_730 = vshufps_avx(auVar102,auVar102,0xaa);
                            local_740 = (RTCHitN  [16])auVar96;
                            local_720 = uVar93;
                            uStack_71c = uVar93;
                            uStack_718 = uVar93;
                            uStack_714 = uVar93;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar197;
                            local_8c0 = *local_a88;
                            local_b30.valid = (int *)local_8c0;
                            local_b30.geometryUserPtr = pGVar4->userPtr;
                            local_b30.context = context->user;
                            local_b30.hit = local_740;
                            local_b30.N = 4;
                            local_b30.ray = (RTCRayN *)ray;
                            if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar241 = ZEXT1664(local_ae0._0_16_);
                              auVar260 = ZEXT1664(auVar132);
                              auVar271 = ZEXT1664(auVar151);
                              auVar277 = ZEXT1664(auVar277._0_16_);
                              auVar283 = ZEXT1664(auVar95);
                              (*pGVar4->intersectionFilterN)(&local_b30);
                              auVar169._8_56_ = extraout_var_02;
                              auVar169._0_8_ = extraout_XMM1_Qa_00;
                              auVar105 = auVar169._0_16_;
                            }
                            if (local_8c0 == (undefined1  [16])0x0) {
                              auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar105 = vpcmpeqd_avx(auVar105,auVar105);
                              auVar102 = auVar102 ^ auVar105;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              auVar105 = vpcmpeqd_avx(auVar96,auVar96);
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar241 = ZEXT1664(auVar241._0_16_);
                                auVar260 = ZEXT1664(auVar260._0_16_);
                                auVar271 = ZEXT1664(auVar271._0_16_);
                                auVar277 = ZEXT1664(auVar277._0_16_);
                                auVar283 = ZEXT1664(auVar283._0_16_);
                                (*p_Var5)(&local_b30);
                                auVar105 = vpcmpeqd_avx(auVar105,auVar105);
                              }
                              auVar151 = vpcmpeqd_avx(local_8c0,_DAT_01f7aa10);
                              auVar102 = auVar151 ^ auVar105;
                              if (local_8c0 != (undefined1  [16])0x0) {
                                auVar151 = auVar151 ^ auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    local_b30.hit);
                                *(undefined1 (*) [16])(local_b30.ray + 0xc0) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x10));
                                *(undefined1 (*) [16])(local_b30.ray + 0xd0) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x20));
                                *(undefined1 (*) [16])(local_b30.ray + 0xe0) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x30));
                                *(undefined1 (*) [16])(local_b30.ray + 0xf0) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x40));
                                *(undefined1 (*) [16])(local_b30.ray + 0x100) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x50));
                                *(undefined1 (*) [16])(local_b30.ray + 0x110) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x60));
                                *(undefined1 (*) [16])(local_b30.ray + 0x120) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x70));
                                *(undefined1 (*) [16])(local_b30.ray + 0x130) = auVar105;
                                auVar105 = vmaskmovps_avx(auVar151,*(undefined1 (*) [16])
                                                                    (local_b30.hit + 0x80));
                                *(undefined1 (*) [16])(local_b30.ray + 0x140) = auVar105;
                              }
                            }
                            auVar109._8_8_ = 0x100000001;
                            auVar109._0_8_ = 0x100000001;
                            if ((auVar109 & auVar102) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar214;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar90 = lVar90 + -1;
              } while (lVar90 != 0);
              uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar118._4_4_ = uVar93;
              auVar118._0_4_ = uVar93;
              auVar118._8_4_ = uVar93;
              auVar118._12_4_ = uVar93;
              auVar118._16_4_ = uVar93;
              auVar118._20_4_ = uVar93;
              auVar118._24_4_ = uVar93;
              auVar118._28_4_ = uVar93;
              auVar145 = vcmpps_avx(_local_840,auVar118,2);
              auVar112 = vandps_avx(auVar145,local_900);
              auVar145 = local_900 & auVar145;
              local_900 = auVar112;
            } while ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar145 >> 0x7f,0) != '\0') ||
                       (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar145 >> 0xbf,0) != '\0') ||
                     (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar145[0x1f] < '\0');
          }
          auVar168._0_4_ = (float)local_920._0_4_ + local_3e0._0_4_;
          auVar168._4_4_ = (float)local_920._4_4_ + local_3e0._4_4_;
          auVar168._8_4_ = fStack_918 + local_3e0._8_4_;
          auVar168._12_4_ = fStack_914 + local_3e0._12_4_;
          auVar168._16_4_ = fStack_910 + local_3e0._16_4_;
          auVar168._20_4_ = fStack_90c + local_3e0._20_4_;
          auVar168._24_4_ = fStack_908 + local_3e0._24_4_;
          auVar168._28_4_ = fStack_904 + local_3e0._28_4_;
          auVar145 = vcmpps_avx(auVar168,auVar118,2);
          auVar112 = vandps_avx(local_5e0,local_6a0);
          auVar112 = vandps_avx(auVar145,auVar112);
          auVar196._0_4_ = (float)local_920._0_4_ + local_3a0._0_4_;
          auVar196._4_4_ = (float)local_920._4_4_ + local_3a0._4_4_;
          auVar196._8_4_ = fStack_918 + local_3a0._8_4_;
          auVar196._12_4_ = fStack_914 + local_3a0._12_4_;
          auVar196._16_4_ = fStack_910 + local_3a0._16_4_;
          auVar196._20_4_ = fStack_90c + local_3a0._20_4_;
          auVar196._24_4_ = fStack_908 + local_3a0._24_4_;
          auVar196._28_4_ = fStack_904 + local_3a0._28_4_;
          auVar280 = vcmpps_avx(auVar196,auVar118,2);
          auVar145 = vandps_avx(local_8a0,local_880);
          auVar145 = vandps_avx(auVar280,auVar145);
          auVar145 = vorps_avx(auVar112,auVar145);
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar145 >> 0x7f,0) != '\0') ||
                (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0xbf,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar145[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar89 * 0x60) = auVar145;
            auVar112 = vblendvps_avx(local_3a0,local_3e0,auVar112);
            *(undefined1 (*) [32])(auStack_160 + uVar89 * 0x60) = auVar112;
            uVar1 = vmovlps_avx(local_570);
            (&uStack_140)[uVar89 * 0xc] = uVar1;
            aiStack_138[uVar89 * 0x18] = local_c08 + 1;
            iVar88 = iVar88 + 1;
          }
        }
      }
    }
    if (iVar88 == 0) break;
    uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar121._4_4_ = uVar93;
    auVar121._0_4_ = uVar93;
    auVar121._8_4_ = uVar93;
    auVar121._12_4_ = uVar93;
    auVar121._16_4_ = uVar93;
    auVar121._20_4_ = uVar93;
    auVar121._24_4_ = uVar93;
    auVar121._28_4_ = uVar93;
    uVar85 = -iVar88;
    pauVar83 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar88 - 1) * 0x60);
    fVar197 = (float)local_920._0_4_;
    fVar211 = (float)local_920._4_4_;
    fVar214 = fStack_918;
    fVar217 = fStack_914;
    fVar213 = fStack_910;
    fVar212 = fStack_90c;
    fVar256 = fStack_908;
    fVar216 = fStack_904;
    while( true ) {
      auVar112 = pauVar83[1];
      auVar146._0_4_ = fVar197 + auVar112._0_4_;
      auVar146._4_4_ = fVar211 + auVar112._4_4_;
      auVar146._8_4_ = fVar214 + auVar112._8_4_;
      auVar146._12_4_ = fVar217 + auVar112._12_4_;
      auVar146._16_4_ = fVar213 + auVar112._16_4_;
      auVar146._20_4_ = fVar212 + auVar112._20_4_;
      auVar146._24_4_ = fVar256 + auVar112._24_4_;
      auVar146._28_4_ = fVar216 + auVar112._28_4_;
      auVar280 = vcmpps_avx(auVar146,auVar121,2);
      auVar145 = vandps_avx(auVar280,*pauVar83);
      _local_740 = auVar145;
      auVar280 = *pauVar83 & auVar280;
      if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar280 >> 0x7f,0) != '\0') ||
            (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar280 >> 0xbf,0) != '\0') ||
          (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar280[0x1f] < '\0') break;
      pauVar83 = pauVar83 + -3;
      uVar85 = uVar85 + 1;
      fVar197 = (float)local_920._0_4_;
      fVar211 = (float)local_920._4_4_;
      fVar214 = fStack_918;
      fVar217 = fStack_914;
      fVar213 = fStack_910;
      fVar212 = fStack_90c;
      fVar256 = fStack_908;
      fVar216 = fStack_904;
      if (uVar85 == 0) goto LAB_015b6f70;
    }
    auVar122._8_4_ = 0x7f800000;
    auVar122._0_8_ = 0x7f8000007f800000;
    auVar122._12_4_ = 0x7f800000;
    auVar122._16_4_ = 0x7f800000;
    auVar122._20_4_ = 0x7f800000;
    auVar122._24_4_ = 0x7f800000;
    auVar122._28_4_ = 0x7f800000;
    auVar112 = vblendvps_avx(auVar122,auVar112,auVar145);
    auVar280 = vshufps_avx(auVar112,auVar112,0xb1);
    auVar280 = vminps_avx(auVar112,auVar280);
    auVar11 = vshufpd_avx(auVar280,auVar280,5);
    auVar280 = vminps_avx(auVar280,auVar11);
    auVar11 = vpermpd_avx2(auVar280,0x4e);
    auVar280 = vminps_avx(auVar280,auVar11);
    auVar112 = vcmpps_avx(auVar112,auVar280,0);
    auVar280 = auVar145 & auVar112;
    if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar280 >> 0x7f,0) != '\0') ||
          (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar280 >> 0xbf,0) != '\0') ||
        (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar280[0x1f] < '\0') {
      auVar145 = vandps_avx(auVar112,auVar145);
    }
    uVar17 = *(ulong *)pauVar83[2];
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar17;
    uVar86 = vmovmskps_avx(auVar145);
    iVar88 = 0;
    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
      iVar88 = iVar88 + 1;
    }
    *(undefined4 *)(local_740 + (uint)(iVar88 << 2)) = 0;
    uVar86 = ~uVar85;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar86 = -uVar85;
    }
    uVar89 = (ulong)uVar86;
    local_c08 = *(int *)(pauVar83[2] + 8);
    *pauVar83 = _local_740;
    uVar93 = (undefined4)uVar17;
    auVar147._4_4_ = uVar93;
    auVar147._0_4_ = uVar93;
    auVar147._8_4_ = uVar93;
    auVar147._12_4_ = uVar93;
    auVar147._16_4_ = uVar93;
    auVar147._20_4_ = uVar93;
    auVar147._24_4_ = uVar93;
    auVar147._28_4_ = uVar93;
    auVar102 = vmovshdup_avx(auVar110);
    auVar102 = vsubps_avx(auVar102,auVar110);
    auVar123._0_4_ = auVar102._0_4_;
    auVar123._4_4_ = auVar123._0_4_;
    auVar123._8_4_ = auVar123._0_4_;
    auVar123._12_4_ = auVar123._0_4_;
    auVar123._16_4_ = auVar123._0_4_;
    auVar123._20_4_ = auVar123._0_4_;
    auVar123._24_4_ = auVar123._0_4_;
    auVar123._28_4_ = auVar123._0_4_;
    auVar102 = vfmadd132ps_fma(auVar123,auVar147,_DAT_01faff20);
    local_3e0 = ZEXT1632(auVar102);
    local_570._8_8_ = 0;
    local_570._0_8_ = *(ulong *)(local_3e0 + (uint)(iVar88 << 2));
  } while( true );
LAB_015b6f70:
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar111._4_4_ = uVar93;
  auVar111._0_4_ = uVar93;
  auVar111._8_4_ = uVar93;
  auVar111._12_4_ = uVar93;
  auVar6 = vcmpps_avx(local_580,auVar111,2);
  uVar84 = vmovmskps_avx(auVar6);
  uVar84 = (uint)uVar91 & uVar84;
  if (uVar84 == 0) {
    return;
  }
  goto LAB_015b4671;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }